

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

bool embree::avx512::CurveNvIntersectorK<8,16>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  undefined1 auVar1 [16];
  Primitive PVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  int iVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  byte bVar52;
  byte bVar53;
  byte bVar54;
  ulong uVar55;
  long lVar56;
  byte bVar57;
  byte bVar58;
  ulong uVar59;
  byte bVar60;
  int iVar61;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  Primitive *pPVar62;
  uint uVar63;
  bool bVar64;
  bool bVar65;
  ulong uVar66;
  uint uVar67;
  uint uVar68;
  uint uVar141;
  uint uVar142;
  uint uVar144;
  uint uVar145;
  uint uVar146;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  uint uVar143;
  uint uVar147;
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [64];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  float pp;
  float fVar148;
  float fVar149;
  undefined1 auVar150 [16];
  undefined1 auVar157 [32];
  float fVar166;
  float fVar168;
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar163 [32];
  float fVar165;
  float fVar167;
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar164 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar172;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar173 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar188;
  float fVar189;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar214;
  float fVar215;
  float fVar216;
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  float fVar217;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar229;
  float fVar230;
  undefined1 auVar228 [32];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  float fVar237;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar244 [32];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar245 [64];
  float fVar246;
  float fVar252;
  undefined1 auVar248 [32];
  undefined1 auVar247 [16];
  float fVar250;
  float fVar251;
  undefined1 auVar249 [64];
  undefined1 auVar253 [16];
  undefined1 auVar254 [64];
  undefined1 auVar255 [28];
  float fVar256;
  undefined1 auVar257 [64];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [32];
  undefined1 auVar261 [64];
  float fVar262;
  float fVar263;
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  float local_ac0;
  float fStack_abc;
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  RTCFilterFunctionNArguments local_a30;
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [16];
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [16];
  undefined1 local_910 [16];
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  undefined1 local_8f0 [16];
  undefined1 local_8e0 [16];
  undefined1 local_8d0 [16];
  Primitive *local_8b8;
  Primitive *local_8b0;
  ulong local_8a8;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  undefined1 auStack_850 [16];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [64];
  undefined1 local_780 [64];
  undefined1 local_720 [32];
  float local_700;
  float fStack_6fc;
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  undefined1 auStack_180 [32];
  ulong uStack_160;
  int aiStack_158 [74];
  
  PVar2 = prim[1];
  uVar66 = (ulong)(byte)PVar2;
  lVar56 = uVar66 * 0x19;
  fVar246 = *(float *)(prim + lVar56 + 0x12);
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar76 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar73 = vsubps_avx(auVar12,*(undefined1 (*) [16])(prim + lVar56 + 6));
  fVar217 = fVar246 * auVar73._0_4_;
  fVar148 = fVar246 * auVar76._0_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar66 * 4 + 6);
  auVar85 = vpmovsxbd_avx2(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar66 * 5 + 6);
  auVar83 = vpmovsxbd_avx2(auVar13);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar66 * 6 + 6);
  auVar86 = vpmovsxbd_avx2(auVar71);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar66 * 0xb + 6);
  auVar87 = vpmovsxbd_avx2(auVar77);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6);
  auVar92 = vpmovsxbd_avx2(auVar69);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar88 = vcvtdq2ps_avx(auVar92);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(prim + (uint)(byte)PVar2 * 0xc + uVar66 + 6);
  auVar84 = vpmovsxbd_avx2(auVar1);
  auVar84 = vcvtdq2ps_avx(auVar84);
  uVar55 = (ulong)(uint)((int)(uVar66 * 9) * 2);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar55 + 6);
  auVar89 = vpmovsxbd_avx2(auVar72);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar55 + uVar66 + 6);
  auVar90 = vpmovsxbd_avx2(auVar70);
  auVar90 = vcvtdq2ps_avx(auVar90);
  uVar59 = (ulong)(uint)((int)(uVar66 * 5) << 2);
  auVar231._8_8_ = 0;
  auVar231._0_8_ = *(ulong *)(prim + uVar59 + 6);
  auVar82 = vpmovsxbd_avx2(auVar231);
  auVar91 = vcvtdq2ps_avx(auVar82);
  auVar102._4_4_ = fVar148;
  auVar102._0_4_ = fVar148;
  auVar102._8_4_ = fVar148;
  auVar102._12_4_ = fVar148;
  auVar102._16_4_ = fVar148;
  auVar102._20_4_ = fVar148;
  auVar102._24_4_ = fVar148;
  auVar102._28_4_ = fVar148;
  auVar104._8_4_ = 1;
  auVar104._0_8_ = 0x100000001;
  auVar104._12_4_ = 1;
  auVar104._16_4_ = 1;
  auVar104._20_4_ = 1;
  auVar104._24_4_ = 1;
  auVar104._28_4_ = 1;
  auVar80 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar94 = ZEXT1632(CONCAT412(fVar246 * auVar76._12_4_,
                               CONCAT48(fVar246 * auVar76._8_4_,
                                        CONCAT44(fVar246 * auVar76._4_4_,fVar148))));
  auVar93 = vpermps_avx2(auVar104,auVar94);
  auVar81 = vpermps_avx512vl(auVar80,auVar94);
  fVar148 = auVar81._0_4_;
  fVar165 = auVar81._4_4_;
  auVar94._4_4_ = fVar165 * auVar86._4_4_;
  auVar94._0_4_ = fVar148 * auVar86._0_4_;
  fVar250 = auVar81._8_4_;
  auVar94._8_4_ = fVar250 * auVar86._8_4_;
  fVar251 = auVar81._12_4_;
  auVar94._12_4_ = fVar251 * auVar86._12_4_;
  fVar252 = auVar81._16_4_;
  auVar94._16_4_ = fVar252 * auVar86._16_4_;
  fVar229 = auVar81._20_4_;
  auVar94._20_4_ = fVar229 * auVar86._20_4_;
  fVar230 = auVar81._24_4_;
  auVar94._24_4_ = fVar230 * auVar86._24_4_;
  auVar94._28_4_ = auVar92._28_4_;
  auVar92._4_4_ = auVar84._4_4_ * fVar165;
  auVar92._0_4_ = auVar84._0_4_ * fVar148;
  auVar92._8_4_ = auVar84._8_4_ * fVar250;
  auVar92._12_4_ = auVar84._12_4_ * fVar251;
  auVar92._16_4_ = auVar84._16_4_ * fVar252;
  auVar92._20_4_ = auVar84._20_4_ * fVar229;
  auVar92._24_4_ = auVar84._24_4_ * fVar230;
  auVar92._28_4_ = auVar82._28_4_;
  auVar82._4_4_ = auVar91._4_4_ * fVar165;
  auVar82._0_4_ = auVar91._0_4_ * fVar148;
  auVar82._8_4_ = auVar91._8_4_ * fVar250;
  auVar82._12_4_ = auVar91._12_4_ * fVar251;
  auVar82._16_4_ = auVar91._16_4_ * fVar252;
  auVar82._20_4_ = auVar91._20_4_ * fVar229;
  auVar82._24_4_ = auVar91._24_4_ * fVar230;
  auVar82._28_4_ = auVar81._28_4_;
  auVar12 = vfmadd231ps_fma(auVar94,auVar93,auVar83);
  auVar13 = vfmadd231ps_fma(auVar92,auVar93,auVar88);
  auVar71 = vfmadd231ps_fma(auVar82,auVar90,auVar93);
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar102,auVar85);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar102,auVar87);
  auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),auVar89,auVar102);
  auVar103._4_4_ = fVar217;
  auVar103._0_4_ = fVar217;
  auVar103._8_4_ = fVar217;
  auVar103._12_4_ = fVar217;
  auVar103._16_4_ = fVar217;
  auVar103._20_4_ = fVar217;
  auVar103._24_4_ = fVar217;
  auVar103._28_4_ = fVar217;
  auVar82 = ZEXT1632(CONCAT412(fVar246 * auVar73._12_4_,
                               CONCAT48(fVar246 * auVar73._8_4_,
                                        CONCAT44(fVar246 * auVar73._4_4_,fVar217))));
  auVar92 = vpermps_avx2(auVar104,auVar82);
  auVar82 = vpermps_avx512vl(auVar80,auVar82);
  fVar246 = auVar82._0_4_;
  fVar148 = auVar82._4_4_;
  auVar93._4_4_ = fVar148 * auVar86._4_4_;
  auVar93._0_4_ = fVar246 * auVar86._0_4_;
  fVar165 = auVar82._8_4_;
  auVar93._8_4_ = fVar165 * auVar86._8_4_;
  fVar250 = auVar82._12_4_;
  auVar93._12_4_ = fVar250 * auVar86._12_4_;
  fVar251 = auVar82._16_4_;
  auVar93._16_4_ = fVar251 * auVar86._16_4_;
  fVar252 = auVar82._20_4_;
  auVar93._20_4_ = fVar252 * auVar86._20_4_;
  fVar229 = auVar82._24_4_;
  auVar93._24_4_ = fVar229 * auVar86._24_4_;
  auVar93._28_4_ = 1;
  auVar80._4_4_ = auVar84._4_4_ * fVar148;
  auVar80._0_4_ = auVar84._0_4_ * fVar246;
  auVar80._8_4_ = auVar84._8_4_ * fVar165;
  auVar80._12_4_ = auVar84._12_4_ * fVar250;
  auVar80._16_4_ = auVar84._16_4_ * fVar251;
  auVar80._20_4_ = auVar84._20_4_ * fVar252;
  auVar80._24_4_ = auVar84._24_4_ * fVar229;
  auVar80._28_4_ = auVar86._28_4_;
  auVar84._4_4_ = auVar91._4_4_ * fVar148;
  auVar84._0_4_ = auVar91._0_4_ * fVar246;
  auVar84._8_4_ = auVar91._8_4_ * fVar165;
  auVar84._12_4_ = auVar91._12_4_ * fVar250;
  auVar84._16_4_ = auVar91._16_4_ * fVar251;
  auVar84._20_4_ = auVar91._20_4_ * fVar252;
  auVar84._24_4_ = auVar91._24_4_ * fVar229;
  auVar84._28_4_ = auVar82._28_4_;
  auVar77 = vfmadd231ps_fma(auVar93,auVar92,auVar83);
  auVar69 = vfmadd231ps_fma(auVar80,auVar92,auVar88);
  auVar1 = vfmadd231ps_fma(auVar84,auVar92,auVar90);
  auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar103,auVar85);
  auVar69 = vfmadd231ps_fma(ZEXT1632(auVar69),auVar103,auVar87);
  auVar99._8_4_ = 0x7fffffff;
  auVar99._0_8_ = 0x7fffffff7fffffff;
  auVar99._12_4_ = 0x7fffffff;
  auVar99._16_4_ = 0x7fffffff;
  auVar99._20_4_ = 0x7fffffff;
  auVar99._24_4_ = 0x7fffffff;
  auVar99._28_4_ = 0x7fffffff;
  auVar1 = vfmadd231ps_fma(ZEXT1632(auVar1),auVar103,auVar89);
  auVar85 = vandps_avx(ZEXT1632(auVar12),auVar99);
  auVar101._8_4_ = 0x219392ef;
  auVar101._0_8_ = 0x219392ef219392ef;
  auVar101._12_4_ = 0x219392ef;
  auVar101._16_4_ = 0x219392ef;
  auVar101._20_4_ = 0x219392ef;
  auVar101._24_4_ = 0x219392ef;
  auVar101._28_4_ = 0x219392ef;
  uVar55 = vcmpps_avx512vl(auVar85,auVar101,1);
  bVar64 = (bool)((byte)uVar55 & 1);
  auVar81._0_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar12._0_4_;
  bVar64 = (bool)((byte)(uVar55 >> 1) & 1);
  auVar81._4_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar12._4_4_;
  bVar64 = (bool)((byte)(uVar55 >> 2) & 1);
  auVar81._8_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar12._8_4_;
  bVar64 = (bool)((byte)(uVar55 >> 3) & 1);
  auVar81._12_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar12._12_4_;
  auVar81._16_4_ = (uint)((byte)(uVar55 >> 4) & 1) * 0x219392ef;
  auVar81._20_4_ = (uint)((byte)(uVar55 >> 5) & 1) * 0x219392ef;
  auVar81._24_4_ = (uint)((byte)(uVar55 >> 6) & 1) * 0x219392ef;
  auVar81._28_4_ = (uint)(byte)(uVar55 >> 7) * 0x219392ef;
  auVar85 = vandps_avx(ZEXT1632(auVar13),auVar99);
  uVar55 = vcmpps_avx512vl(auVar85,auVar101,1);
  bVar64 = (bool)((byte)uVar55 & 1);
  auVar95._0_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar13._0_4_;
  bVar64 = (bool)((byte)(uVar55 >> 1) & 1);
  auVar95._4_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar13._4_4_;
  bVar64 = (bool)((byte)(uVar55 >> 2) & 1);
  auVar95._8_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar13._8_4_;
  bVar64 = (bool)((byte)(uVar55 >> 3) & 1);
  auVar95._12_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar13._12_4_;
  auVar95._16_4_ = (uint)((byte)(uVar55 >> 4) & 1) * 0x219392ef;
  auVar95._20_4_ = (uint)((byte)(uVar55 >> 5) & 1) * 0x219392ef;
  auVar95._24_4_ = (uint)((byte)(uVar55 >> 6) & 1) * 0x219392ef;
  auVar95._28_4_ = (uint)(byte)(uVar55 >> 7) * 0x219392ef;
  auVar85 = vandps_avx(ZEXT1632(auVar71),auVar99);
  uVar55 = vcmpps_avx512vl(auVar85,auVar101,1);
  bVar64 = (bool)((byte)uVar55 & 1);
  auVar85._0_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar71._0_4_;
  bVar64 = (bool)((byte)(uVar55 >> 1) & 1);
  auVar85._4_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar71._4_4_;
  bVar64 = (bool)((byte)(uVar55 >> 2) & 1);
  auVar85._8_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar71._8_4_;
  bVar64 = (bool)((byte)(uVar55 >> 3) & 1);
  auVar85._12_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar71._12_4_;
  auVar85._16_4_ = (uint)((byte)(uVar55 >> 4) & 1) * 0x219392ef;
  auVar85._20_4_ = (uint)((byte)(uVar55 >> 5) & 1) * 0x219392ef;
  auVar85._24_4_ = (uint)((byte)(uVar55 >> 6) & 1) * 0x219392ef;
  auVar85._28_4_ = (uint)(byte)(uVar55 >> 7) * 0x219392ef;
  auVar83 = vrcp14ps_avx512vl(auVar81);
  auVar100._8_4_ = 0x3f800000;
  auVar100._0_8_ = 0x3f8000003f800000;
  auVar100._12_4_ = 0x3f800000;
  auVar100._16_4_ = 0x3f800000;
  auVar100._20_4_ = 0x3f800000;
  auVar100._24_4_ = 0x3f800000;
  auVar100._28_4_ = 0x3f800000;
  auVar12 = vfnmadd213ps_fma(auVar81,auVar83,auVar100);
  auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar83,auVar83);
  auVar83 = vrcp14ps_avx512vl(auVar95);
  auVar13 = vfnmadd213ps_fma(auVar95,auVar83,auVar100);
  auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar83,auVar83);
  auVar83 = vrcp14ps_avx512vl(auVar85);
  auVar71 = vfnmadd213ps_fma(auVar85,auVar83,auVar100);
  auVar71 = vfmadd132ps_fma(ZEXT1632(auVar71),auVar83,auVar83);
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar66 * 7 + 6));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,ZEXT1632(auVar77));
  auVar89._4_4_ = auVar12._4_4_ * auVar85._4_4_;
  auVar89._0_4_ = auVar12._0_4_ * auVar85._0_4_;
  auVar89._8_4_ = auVar12._8_4_ * auVar85._8_4_;
  auVar89._12_4_ = auVar12._12_4_ * auVar85._12_4_;
  auVar89._16_4_ = auVar85._16_4_ * 0.0;
  auVar89._20_4_ = auVar85._20_4_ * 0.0;
  auVar89._24_4_ = auVar85._24_4_ * 0.0;
  auVar89._28_4_ = auVar85._28_4_;
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar66 * 9 + 6));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,ZEXT1632(auVar77));
  auVar84 = vpbroadcastd_avx512vl();
  auVar83 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar2 * 0x10 + 6));
  auVar98._0_4_ = auVar12._0_4_ * auVar85._0_4_;
  auVar98._4_4_ = auVar12._4_4_ * auVar85._4_4_;
  auVar98._8_4_ = auVar12._8_4_ * auVar85._8_4_;
  auVar98._12_4_ = auVar12._12_4_ * auVar85._12_4_;
  auVar98._16_4_ = auVar85._16_4_ * 0.0;
  auVar98._20_4_ = auVar85._20_4_ * 0.0;
  auVar98._24_4_ = auVar85._24_4_ * 0.0;
  auVar98._28_4_ = 0;
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar2 * 0x10 + uVar66 * -2 + 6));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,ZEXT1632(auVar69));
  auVar90._4_4_ = auVar13._4_4_ * auVar85._4_4_;
  auVar90._0_4_ = auVar13._0_4_ * auVar85._0_4_;
  auVar90._8_4_ = auVar13._8_4_ * auVar85._8_4_;
  auVar90._12_4_ = auVar13._12_4_ * auVar85._12_4_;
  auVar90._16_4_ = auVar85._16_4_ * 0.0;
  auVar90._20_4_ = auVar85._20_4_ * 0.0;
  auVar90._24_4_ = auVar85._24_4_ * 0.0;
  auVar90._28_4_ = auVar85._28_4_;
  auVar85 = vcvtdq2ps_avx(auVar83);
  auVar85 = vsubps_avx(auVar85,ZEXT1632(auVar69));
  auVar97._0_4_ = auVar13._0_4_ * auVar85._0_4_;
  auVar97._4_4_ = auVar13._4_4_ * auVar85._4_4_;
  auVar97._8_4_ = auVar13._8_4_ * auVar85._8_4_;
  auVar97._12_4_ = auVar13._12_4_ * auVar85._12_4_;
  auVar97._16_4_ = auVar85._16_4_ * 0.0;
  auVar97._20_4_ = auVar85._20_4_ * 0.0;
  auVar97._24_4_ = auVar85._24_4_ * 0.0;
  auVar97._28_4_ = 0;
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar59 + uVar66 + 6));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,ZEXT1632(auVar1));
  auVar91._4_4_ = auVar85._4_4_ * auVar71._4_4_;
  auVar91._0_4_ = auVar85._0_4_ * auVar71._0_4_;
  auVar91._8_4_ = auVar85._8_4_ * auVar71._8_4_;
  auVar91._12_4_ = auVar85._12_4_ * auVar71._12_4_;
  auVar91._16_4_ = auVar85._16_4_ * 0.0;
  auVar91._20_4_ = auVar85._20_4_ * 0.0;
  auVar91._24_4_ = auVar85._24_4_ * 0.0;
  auVar91._28_4_ = auVar85._28_4_;
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar66 * 0x17 + 6));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,ZEXT1632(auVar1));
  auVar96._0_4_ = auVar71._0_4_ * auVar85._0_4_;
  auVar96._4_4_ = auVar71._4_4_ * auVar85._4_4_;
  auVar96._8_4_ = auVar71._8_4_ * auVar85._8_4_;
  auVar96._12_4_ = auVar71._12_4_ * auVar85._12_4_;
  auVar96._16_4_ = auVar85._16_4_ * 0.0;
  auVar96._20_4_ = auVar85._20_4_ * 0.0;
  auVar96._24_4_ = auVar85._24_4_ * 0.0;
  auVar96._28_4_ = 0;
  auVar85 = vpminsd_avx2(auVar89,auVar98);
  auVar83 = vpminsd_avx2(auVar90,auVar97);
  auVar85 = vmaxps_avx(auVar85,auVar83);
  auVar83 = vpminsd_avx2(auVar91,auVar96);
  uVar172 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar86._4_4_ = uVar172;
  auVar86._0_4_ = uVar172;
  auVar86._8_4_ = uVar172;
  auVar86._12_4_ = uVar172;
  auVar86._16_4_ = uVar172;
  auVar86._20_4_ = uVar172;
  auVar86._24_4_ = uVar172;
  auVar86._28_4_ = uVar172;
  auVar83 = vmaxps_avx512vl(auVar83,auVar86);
  auVar85 = vmaxps_avx(auVar85,auVar83);
  auVar83._8_4_ = 0x3f7ffffa;
  auVar83._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar83._12_4_ = 0x3f7ffffa;
  auVar83._16_4_ = 0x3f7ffffa;
  auVar83._20_4_ = 0x3f7ffffa;
  auVar83._24_4_ = 0x3f7ffffa;
  auVar83._28_4_ = 0x3f7ffffa;
  local_620 = vmulps_avx512vl(auVar85,auVar83);
  auVar85 = vpmaxsd_avx2(auVar89,auVar98);
  auVar83 = vpmaxsd_avx2(auVar90,auVar97);
  auVar85 = vminps_avx(auVar85,auVar83);
  auVar83 = vpmaxsd_avx2(auVar91,auVar96);
  uVar172 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar87._4_4_ = uVar172;
  auVar87._0_4_ = uVar172;
  auVar87._8_4_ = uVar172;
  auVar87._12_4_ = uVar172;
  auVar87._16_4_ = uVar172;
  auVar87._20_4_ = uVar172;
  auVar87._24_4_ = uVar172;
  auVar87._28_4_ = uVar172;
  auVar83 = vminps_avx512vl(auVar83,auVar87);
  auVar85 = vminps_avx(auVar85,auVar83);
  auVar88._8_4_ = 0x3f800003;
  auVar88._0_8_ = 0x3f8000033f800003;
  auVar88._12_4_ = 0x3f800003;
  auVar88._16_4_ = 0x3f800003;
  auVar88._20_4_ = 0x3f800003;
  auVar88._24_4_ = 0x3f800003;
  auVar88._28_4_ = 0x3f800003;
  auVar85 = vmulps_avx512vl(auVar85,auVar88);
  uVar16 = vpcmpgtd_avx512vl(auVar84,_DAT_01fe9900);
  uVar15 = vcmpps_avx512vl(local_620,auVar85,2);
  if ((byte)((byte)uVar15 & (byte)uVar16) == 0) {
    return false;
  }
  local_8a8 = (ulong)(byte)((byte)uVar15 & (byte)uVar16);
  pPVar62 = prim + lVar56 + 0x16;
  auVar164 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_500 = vmovdqa64_avx512f(auVar164);
  local_8b8 = pPVar62;
  local_8b0 = prim;
LAB_01cb22a9:
  iVar61 = 0;
  for (uVar55 = local_8a8; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
    iVar61 = iVar61 + 1;
  }
  local_8a8 = local_8a8 - 1 & local_8a8;
  uVar55 = (ulong)(uint)(iVar61 << 6);
  auVar12 = *(undefined1 (*) [16])(pPVar62 + uVar55);
  if (local_8a8 != 0) {
    uVar59 = local_8a8 - 1 & local_8a8;
    for (uVar66 = local_8a8; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
    }
    if (uVar59 != 0) {
      for (; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar13 = *(undefined1 (*) [16])(pPVar62 + uVar55 + 0x10);
  auVar71 = *(undefined1 (*) [16])(pPVar62 + uVar55 + 0x20);
  auVar77 = *(undefined1 (*) [16])(pPVar62 + uVar55 + 0x30);
  auVar69 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar1 = vinsertps_avx(auVar69,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  uVar63 = *(uint *)(prim + 2);
  uVar172 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar78._4_4_ = uVar172;
  auVar78._0_4_ = uVar172;
  auVar78._8_4_ = uVar172;
  auVar78._12_4_ = uVar172;
  local_7e0._16_4_ = uVar172;
  local_7e0._0_16_ = auVar78;
  local_7e0._20_4_ = uVar172;
  local_7e0._24_4_ = uVar172;
  local_7e0._28_4_ = uVar172;
  auVar261 = ZEXT3264(local_7e0);
  uVar172 = *(undefined4 *)(ray + k * 4 + 0x140);
  auVar79._4_4_ = uVar172;
  auVar79._0_4_ = uVar172;
  auVar79._8_4_ = uVar172;
  auVar79._12_4_ = uVar172;
  local_800._16_4_ = uVar172;
  local_800._0_16_ = auVar79;
  local_800._20_4_ = uVar172;
  local_800._24_4_ = uVar172;
  local_800._28_4_ = uVar172;
  auVar69 = vunpcklps_avx(auVar78,auVar79);
  fVar246 = *(float *)(ray + k * 4 + 0x180);
  auVar253._4_4_ = fVar246;
  auVar253._0_4_ = fVar246;
  auVar253._8_4_ = fVar246;
  auVar253._12_4_ = fVar246;
  local_820._16_4_ = fVar246;
  local_820._0_16_ = auVar253;
  local_820._20_4_ = fVar246;
  local_820._24_4_ = fVar246;
  local_820._28_4_ = fVar246;
  local_9b0 = vinsertps_avx(auVar69,auVar253,0x28);
  auVar254 = ZEXT1664(local_9b0);
  auVar73._0_4_ = auVar12._0_4_ + auVar13._0_4_ + auVar71._0_4_ + auVar77._0_4_;
  auVar73._4_4_ = auVar12._4_4_ + auVar13._4_4_ + auVar71._4_4_ + auVar77._4_4_;
  auVar73._8_4_ = auVar12._8_4_ + auVar13._8_4_ + auVar71._8_4_ + auVar77._8_4_;
  auVar73._12_4_ = auVar12._12_4_ + auVar13._12_4_ + auVar71._12_4_ + auVar77._12_4_;
  auVar76._8_4_ = 0x3e800000;
  auVar76._0_8_ = 0x3e8000003e800000;
  auVar76._12_4_ = 0x3e800000;
  auVar69 = vmulps_avx512vl(auVar73,auVar76);
  auVar69 = vsubps_avx(auVar69,auVar1);
  auVar69 = vdpps_avx(auVar69,local_9b0,0x7f);
  fVar148 = *(float *)(ray + k * 4 + 0xc0);
  local_9c0 = vdpps_avx(local_9b0,local_9b0,0x7f);
  auVar257 = ZEXT1664(local_9c0);
  auVar74._4_12_ = ZEXT812(0) << 0x20;
  auVar74._0_4_ = local_9c0._0_4_;
  auVar70 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar74);
  auVar72 = vfnmadd213ss_fma(auVar70,local_9c0,ZEXT416(0x40000000));
  fVar165 = auVar69._0_4_ * auVar70._0_4_ * auVar72._0_4_;
  auVar75._4_4_ = fVar165;
  auVar75._0_4_ = fVar165;
  auVar75._8_4_ = fVar165;
  auVar75._12_4_ = fVar165;
  auVar69 = vfmadd231ps_fma(auVar1,local_9b0,auVar75);
  auVar69 = vblendps_avx(auVar69,ZEXT816(0) << 0x40,8);
  auVar12 = vsubps_avx(auVar12,auVar69);
  auVar71 = vsubps_avx(auVar71,auVar69);
  auVar245 = ZEXT1664(auVar71);
  auVar13 = vsubps_avx(auVar13,auVar69);
  auVar249 = ZEXT1664(auVar13);
  auVar77 = vsubps_avx(auVar77,auVar69);
  auVar85 = vbroadcastss_avx512vl(auVar12);
  auVar106._8_4_ = 1;
  auVar106._0_8_ = 0x100000001;
  auVar106._12_4_ = 1;
  auVar106._16_4_ = 1;
  auVar106._20_4_ = 1;
  auVar106._24_4_ = 1;
  auVar106._28_4_ = 1;
  local_940 = ZEXT1632(auVar12);
  auVar83 = vpermps_avx512vl(auVar106,local_940);
  auVar107._8_4_ = 2;
  auVar107._0_8_ = 0x200000002;
  auVar107._12_4_ = 2;
  auVar107._16_4_ = 2;
  auVar107._20_4_ = 2;
  auVar107._24_4_ = 2;
  auVar107._28_4_ = 2;
  auVar86 = vpermps_avx512vl(auVar107,local_940);
  auVar108._8_4_ = 3;
  auVar108._0_8_ = 0x300000003;
  auVar108._12_4_ = 3;
  auVar108._16_4_ = 3;
  auVar108._20_4_ = 3;
  auVar108._24_4_ = 3;
  auVar108._28_4_ = 3;
  auVar87 = vpermps_avx512vl(auVar108,local_940);
  auVar88 = vbroadcastss_avx512vl(auVar13);
  local_980 = ZEXT1632(auVar13);
  auVar84 = vpermps_avx512vl(auVar106,local_980);
  auVar89 = vpermps_avx512vl(auVar107,local_980);
  auVar90 = vpermps_avx512vl(auVar108,local_980);
  auVar91 = vbroadcastss_avx512vl(auVar71);
  local_960 = ZEXT1632(auVar71);
  auVar92 = vpermps_avx512vl(auVar106,local_960);
  auVar82 = vpermps_avx512vl(auVar107,local_960);
  auVar93 = vpermps_avx512vl(auVar108,local_960);
  auVar94 = vbroadcastss_avx512vl(auVar77);
  _local_9a0 = ZEXT1632(auVar77);
  local_5a0 = vpermps_avx512vl(auVar106,_local_9a0);
  local_5c0 = vpermps_avx2(auVar107,_local_9a0);
  local_580 = vpermps_avx512vl(auVar108,_local_9a0);
  auVar12 = vfmadd231ps_fma(ZEXT432((uint)(fVar246 * fVar246)),local_800,local_800);
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),local_7e0,local_7e0);
  local_560._0_4_ = auVar12._0_4_;
  local_560._4_4_ = local_560._0_4_;
  local_560._8_4_ = local_560._0_4_;
  local_560._12_4_ = local_560._0_4_;
  local_560._16_4_ = local_560._0_4_;
  local_560._20_4_ = local_560._0_4_;
  local_560._24_4_ = local_560._0_4_;
  local_560._28_4_ = local_560._0_4_;
  auVar105._8_4_ = 0x7fffffff;
  auVar105._0_8_ = 0x7fffffff7fffffff;
  auVar105._12_4_ = 0x7fffffff;
  auVar105._16_4_ = 0x7fffffff;
  auVar105._20_4_ = 0x7fffffff;
  auVar105._24_4_ = 0x7fffffff;
  auVar105._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_560,auVar105);
  local_920 = ZEXT416((uint)fVar165);
  local_600 = fVar148 - fVar165;
  fStack_5fc = local_600;
  fStack_5f8 = local_600;
  fStack_5f4 = local_600;
  fStack_5f0 = local_600;
  fStack_5ec = local_600;
  fStack_5e8 = local_600;
  fStack_5e4 = local_600;
  auVar164 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar164);
  iVar61 = 1;
  uVar55 = 0;
  bVar64 = false;
  auVar164 = vpbroadcastd_avx512f();
  local_4c0 = vmovdqa64_avx512f(auVar164);
  auVar12 = vsqrtss_avx(local_9c0,local_9c0);
  auVar13 = vsqrtss_avx(local_9c0,local_9c0);
  local_6d0 = ZEXT816(0x3f80000000000000);
  auVar164 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 0x3f8000003f800000)
                                                                       ))))));
  local_5e0 = local_580;
  do {
    auVar71 = vmovshdup_avx(local_6d0);
    auVar71 = vsubps_avx(auVar71,local_6d0);
    auVar157._0_4_ = auVar71._0_4_;
    fVar14 = auVar157._0_4_ * 0.04761905;
    uVar172 = local_6d0._0_4_;
    auVar234._4_4_ = uVar172;
    auVar234._0_4_ = uVar172;
    auVar234._8_4_ = uVar172;
    auVar234._12_4_ = uVar172;
    auVar234._16_4_ = uVar172;
    auVar234._20_4_ = uVar172;
    auVar234._24_4_ = uVar172;
    auVar234._28_4_ = uVar172;
    auVar157._4_4_ = auVar157._0_4_;
    auVar157._8_4_ = auVar157._0_4_;
    auVar157._12_4_ = auVar157._0_4_;
    auVar157._16_4_ = auVar157._0_4_;
    auVar157._20_4_ = auVar157._0_4_;
    auVar157._24_4_ = auVar157._0_4_;
    auVar157._28_4_ = auVar157._0_4_;
    auVar71 = vfmadd231ps_fma(auVar234,auVar157,_DAT_01faff20);
    auVar80 = vsubps_avx(auVar164._0_32_,ZEXT1632(auVar71));
    fVar246 = auVar80._0_4_;
    fVar251 = auVar80._4_4_;
    fVar229 = auVar80._8_4_;
    fVar217 = auVar80._12_4_;
    fVar237 = auVar80._16_4_;
    fVar263 = auVar80._20_4_;
    fVar189 = auVar80._24_4_;
    fVar149 = fVar246 * fVar246 * fVar246;
    fVar166 = fVar251 * fVar251 * fVar251;
    auVar115._4_4_ = fVar166;
    auVar115._0_4_ = fVar149;
    fVar167 = fVar229 * fVar229 * fVar229;
    auVar115._8_4_ = fVar167;
    fVar168 = fVar217 * fVar217 * fVar217;
    auVar115._12_4_ = fVar168;
    fVar169 = fVar237 * fVar237 * fVar237;
    auVar115._16_4_ = fVar169;
    fVar170 = fVar263 * fVar263 * fVar263;
    auVar115._20_4_ = fVar170;
    fVar171 = fVar189 * fVar189 * fVar189;
    auVar115._24_4_ = fVar171;
    auVar115._28_4_ = auVar157._0_4_;
    auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar95 = vmulps_avx512vl(auVar115,auVar81);
    fVar250 = auVar71._0_4_;
    fVar252 = auVar71._4_4_;
    fVar230 = auVar71._8_4_;
    fVar262 = auVar71._12_4_;
    fVar188 = fVar250 * fVar250 * fVar250;
    fVar214 = fVar252 * fVar252 * fVar252;
    fVar215 = fVar230 * fVar230 * fVar230;
    fVar216 = fVar262 * fVar262 * fVar262;
    auVar51._28_4_ = DAT_01faff20._28_4_;
    auVar51._0_28_ = ZEXT1628(CONCAT412(fVar216,CONCAT48(fVar215,CONCAT44(fVar214,fVar188))));
    auVar139._0_4_ = fVar250 * fVar246;
    auVar139._4_4_ = fVar252 * fVar251;
    auVar139._8_4_ = fVar230 * fVar229;
    auVar139._12_4_ = fVar262 * fVar217;
    auVar139._16_4_ = fVar237 * 0.0;
    auVar139._20_4_ = fVar263 * 0.0;
    auVar139._28_36_ = auVar254._28_36_;
    auVar139._24_4_ = fVar189 * 0.0;
    auVar96 = vmulps_avx512vl(auVar51,auVar81);
    fVar256 = auVar96._28_4_ + auVar157._0_4_;
    auVar116._4_4_ = fVar166 * 0.16666667;
    auVar116._0_4_ = fVar149 * 0.16666667;
    auVar116._8_4_ = fVar167 * 0.16666667;
    auVar116._12_4_ = fVar168 * 0.16666667;
    auVar116._16_4_ = fVar169 * 0.16666667;
    auVar116._20_4_ = fVar170 * 0.16666667;
    auVar116._24_4_ = fVar171 * 0.16666667;
    auVar116._28_4_ = fVar256;
    auVar117._4_4_ =
         (auVar139._4_4_ * fVar251 * 12.0 + auVar139._4_4_ * fVar252 * 6.0 + fVar214 + auVar95._4_4_
         ) * 0.16666667;
    auVar117._0_4_ =
         (auVar139._0_4_ * fVar246 * 12.0 + auVar139._0_4_ * fVar250 * 6.0 + fVar188 + auVar95._0_4_
         ) * 0.16666667;
    auVar117._8_4_ =
         (auVar139._8_4_ * fVar229 * 12.0 + auVar139._8_4_ * fVar230 * 6.0 + fVar215 + auVar95._8_4_
         ) * 0.16666667;
    auVar117._12_4_ =
         (auVar139._12_4_ * fVar217 * 12.0 + auVar139._12_4_ * fVar262 * 6.0 +
         fVar216 + auVar95._12_4_) * 0.16666667;
    auVar117._16_4_ =
         (auVar139._16_4_ * fVar237 * 12.0 + auVar139._16_4_ * 0.0 * 6.0 + auVar95._16_4_ + 0.0) *
         0.16666667;
    auVar117._20_4_ =
         (auVar139._20_4_ * fVar263 * 12.0 + auVar139._20_4_ * 0.0 * 6.0 + auVar95._20_4_ + 0.0) *
         0.16666667;
    auVar117._24_4_ =
         (auVar139._24_4_ * fVar189 * 12.0 + auVar139._24_4_ * 0.0 * 6.0 + auVar95._24_4_ + 0.0) *
         0.16666667;
    auVar117._28_4_ = auVar257._28_4_;
    auVar118._4_4_ =
         (auVar96._4_4_ + fVar166 + auVar139._4_4_ * fVar252 * 12.0 + auVar139._4_4_ * fVar251 * 6.0
         ) * 0.16666667;
    auVar118._0_4_ =
         (auVar96._0_4_ + fVar149 + auVar139._0_4_ * fVar250 * 12.0 + auVar139._0_4_ * fVar246 * 6.0
         ) * 0.16666667;
    auVar118._8_4_ =
         (auVar96._8_4_ + fVar167 + auVar139._8_4_ * fVar230 * 12.0 + auVar139._8_4_ * fVar229 * 6.0
         ) * 0.16666667;
    auVar118._12_4_ =
         (auVar96._12_4_ + fVar168 +
         auVar139._12_4_ * fVar262 * 12.0 + auVar139._12_4_ * fVar217 * 6.0) * 0.16666667;
    auVar118._16_4_ =
         (auVar96._16_4_ + fVar169 + auVar139._16_4_ * 0.0 * 12.0 + auVar139._16_4_ * fVar237 * 6.0)
         * 0.16666667;
    auVar118._20_4_ =
         (auVar96._20_4_ + fVar170 + auVar139._20_4_ * 0.0 * 12.0 + auVar139._20_4_ * fVar263 * 6.0)
         * 0.16666667;
    auVar118._24_4_ =
         (auVar96._24_4_ + fVar171 + auVar139._24_4_ * 0.0 * 12.0 + auVar139._24_4_ * fVar189 * 6.0)
         * 0.16666667;
    auVar118._28_4_ = auVar261._28_4_;
    auVar119._28_4_ = fVar256 + auVar257._28_4_ + auVar164._28_4_;
    auVar119._0_28_ =
         ZEXT1628(CONCAT412(fVar216 * 0.16666667,
                            CONCAT48(fVar215 * 0.16666667,
                                     CONCAT44(fVar214 * 0.16666667,fVar188 * 0.16666667))));
    auVar95 = vmulps_avx512vl(auVar94,auVar119);
    auVar96 = vmulps_avx512vl(local_5a0,auVar119);
    auVar120._4_4_ = local_5c0._4_4_ * fVar214 * 0.16666667;
    auVar120._0_4_ = local_5c0._0_4_ * fVar188 * 0.16666667;
    auVar120._8_4_ = local_5c0._8_4_ * fVar215 * 0.16666667;
    auVar120._12_4_ = local_5c0._12_4_ * fVar216 * 0.16666667;
    auVar120._16_4_ = local_5c0._16_4_ * 0.0;
    auVar120._20_4_ = local_5c0._20_4_ * 0.0;
    auVar120._24_4_ = local_5c0._24_4_ * 0.0;
    auVar120._28_4_ = auVar157._0_4_;
    auVar97 = vmulps_avx512vl(local_5e0,auVar119);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar118,auVar91);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar118,auVar92);
    auVar98 = vfmadd231ps_avx512vl(auVar120,auVar118,auVar82);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar93,auVar118);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar117,auVar88);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar117,auVar84);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar117,auVar89);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar90,auVar117);
    auVar99 = vfmadd231ps_avx512vl(auVar95,auVar116,auVar85);
    auVar100 = vfmadd231ps_avx512vl(auVar96,auVar116,auVar83);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar116,auVar86);
    auVar95 = vfmadd231ps_avx512vl(auVar97,auVar87,auVar116);
    auVar101 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar96 = vxorps_avx512vl(auVar80,auVar101);
    auVar97 = vxorps_avx512vl(ZEXT1632(auVar71),auVar101);
    auVar235._0_4_ = auVar97._0_4_ * fVar250;
    auVar235._4_4_ = auVar97._4_4_ * fVar252;
    auVar235._8_4_ = auVar97._8_4_ * fVar230;
    auVar235._12_4_ = auVar97._12_4_ * fVar262;
    auVar235._16_4_ = auVar97._16_4_ * 0.0;
    auVar235._20_4_ = auVar97._20_4_ * 0.0;
    auVar235._24_4_ = auVar97._24_4_ * 0.0;
    auVar235._28_4_ = 0;
    auVar97 = vmulps_avx512vl(auVar139._0_32_,auVar81);
    auVar81 = vsubps_avx(auVar235,auVar97);
    auVar113._4_4_ = auVar96._4_4_ * fVar251 * 0.5;
    auVar113._0_4_ = auVar96._0_4_ * fVar246 * 0.5;
    auVar113._8_4_ = auVar96._8_4_ * fVar229 * 0.5;
    auVar113._12_4_ = auVar96._12_4_ * fVar217 * 0.5;
    auVar113._16_4_ = auVar96._16_4_ * fVar237 * 0.5;
    auVar113._20_4_ = auVar96._20_4_ * fVar263 * 0.5;
    auVar113._24_4_ = auVar96._24_4_ * fVar189 * 0.5;
    auVar113._28_4_ = auVar80._28_4_;
    auVar121._4_4_ = auVar81._4_4_ * 0.5;
    auVar121._0_4_ = auVar81._0_4_ * 0.5;
    auVar121._8_4_ = auVar81._8_4_ * 0.5;
    auVar121._12_4_ = auVar81._12_4_ * 0.5;
    auVar121._16_4_ = auVar81._16_4_ * 0.5;
    auVar121._20_4_ = auVar81._20_4_ * 0.5;
    auVar121._24_4_ = auVar81._24_4_ * 0.5;
    auVar121._28_4_ = auVar81._28_4_;
    auVar122._4_4_ = (auVar97._4_4_ + fVar251 * fVar251) * 0.5;
    auVar122._0_4_ = (auVar97._0_4_ + fVar246 * fVar246) * 0.5;
    auVar122._8_4_ = (auVar97._8_4_ + fVar229 * fVar229) * 0.5;
    auVar122._12_4_ = (auVar97._12_4_ + fVar217 * fVar217) * 0.5;
    auVar122._16_4_ = (auVar97._16_4_ + fVar237 * fVar237) * 0.5;
    auVar122._20_4_ = (auVar97._20_4_ + fVar263 * fVar263) * 0.5;
    auVar122._24_4_ = (auVar97._24_4_ + fVar189 * fVar189) * 0.5;
    auVar122._28_4_ = auVar97._28_4_ + auVar245._28_4_;
    fVar246 = fVar250 * fVar250 * 0.5;
    fVar250 = fVar252 * fVar252 * 0.5;
    fVar251 = fVar230 * fVar230 * 0.5;
    fVar252 = fVar262 * fVar262 * 0.5;
    auVar125._28_4_ = auVar249._28_4_;
    auVar125._0_28_ = ZEXT1628(CONCAT412(fVar252,CONCAT48(fVar251,CONCAT44(fVar250,fVar246))));
    auVar126._4_4_ = auVar94._4_4_ * fVar250;
    auVar126._0_4_ = auVar94._0_4_ * fVar246;
    auVar126._8_4_ = auVar94._8_4_ * fVar251;
    auVar126._12_4_ = auVar94._12_4_ * fVar252;
    auVar126._16_4_ = auVar94._16_4_ * 0.0;
    auVar126._20_4_ = auVar94._20_4_ * 0.0;
    auVar126._24_4_ = auVar94._24_4_ * 0.0;
    auVar126._28_4_ = 0x3f000000;
    auVar80 = vmulps_avx512vl(local_5a0,auVar125);
    auVar228._4_4_ = local_5c0._4_4_ * fVar250;
    auVar228._0_4_ = local_5c0._0_4_ * fVar246;
    auVar228._8_4_ = local_5c0._8_4_ * fVar251;
    auVar228._12_4_ = local_5c0._12_4_ * fVar252;
    auVar228._16_4_ = local_5c0._16_4_ * 0.0;
    auVar228._20_4_ = local_5c0._20_4_ * 0.0;
    auVar228._24_4_ = local_5c0._24_4_ * 0.0;
    auVar228._28_4_ = auVar94._28_4_;
    auVar81 = vmulps_avx512vl(local_5e0,auVar125);
    auVar96 = vfmadd231ps_avx512vl(auVar126,auVar122,auVar91);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar122,auVar92);
    auVar97 = vfmadd231ps_avx512vl(auVar228,auVar122,auVar82);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar93,auVar122);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar121,auVar88);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar121,auVar84);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar121,auVar89);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar90,auVar121);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar113,auVar85);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar113,auVar83);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar113,auVar86);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar87,auVar113);
    auVar32._4_4_ = auVar96._4_4_ * fVar14;
    auVar32._0_4_ = auVar96._0_4_ * fVar14;
    auVar32._8_4_ = auVar96._8_4_ * fVar14;
    auVar32._12_4_ = auVar96._12_4_ * fVar14;
    auVar32._16_4_ = auVar96._16_4_ * fVar14;
    auVar32._20_4_ = auVar96._20_4_ * fVar14;
    auVar32._24_4_ = auVar96._24_4_ * fVar14;
    auVar32._28_4_ = auVar261._28_4_;
    auVar261 = ZEXT3264(auVar32);
    auVar33._4_4_ = auVar80._4_4_ * fVar14;
    auVar33._0_4_ = auVar80._0_4_ * fVar14;
    auVar33._8_4_ = auVar80._8_4_ * fVar14;
    auVar33._12_4_ = auVar80._12_4_ * fVar14;
    auVar33._16_4_ = auVar80._16_4_ * fVar14;
    auVar33._20_4_ = auVar80._20_4_ * fVar14;
    auVar33._24_4_ = auVar80._24_4_ * fVar14;
    auVar33._28_4_ = 0x3e2aaaab;
    auVar34._4_4_ = auVar97._4_4_ * fVar14;
    auVar34._0_4_ = auVar97._0_4_ * fVar14;
    auVar34._8_4_ = auVar97._8_4_ * fVar14;
    auVar34._12_4_ = auVar97._12_4_ * fVar14;
    auVar34._16_4_ = auVar97._16_4_ * fVar14;
    auVar34._20_4_ = auVar97._20_4_ * fVar14;
    auVar34._24_4_ = auVar97._24_4_ * fVar14;
    auVar34._28_4_ = 0x40c00000;
    fVar246 = auVar81._0_4_ * fVar14;
    fVar250 = auVar81._4_4_ * fVar14;
    auVar35._4_4_ = fVar250;
    auVar35._0_4_ = fVar246;
    fVar251 = auVar81._8_4_ * fVar14;
    auVar35._8_4_ = fVar251;
    fVar252 = auVar81._12_4_ * fVar14;
    auVar35._12_4_ = fVar252;
    fVar229 = auVar81._16_4_ * fVar14;
    auVar35._16_4_ = fVar229;
    fVar230 = auVar81._20_4_ * fVar14;
    auVar35._20_4_ = fVar230;
    fVar217 = auVar81._24_4_ * fVar14;
    auVar35._24_4_ = fVar217;
    auVar35._28_4_ = fVar14;
    auVar71 = vxorps_avx512vl(auVar93._0_16_,auVar93._0_16_);
    auVar102 = vpermt2ps_avx512vl(auVar99,_DAT_01feed00,ZEXT1632(auVar71));
    auVar254 = ZEXT3264(auVar102);
    auVar103 = vpermt2ps_avx512vl(auVar100,_DAT_01feed00,ZEXT1632(auVar71));
    auVar96 = ZEXT1632(auVar71);
    auVar104 = vpermt2ps_avx512vl(auVar98,_DAT_01feed00,auVar96);
    auVar257 = ZEXT3264(auVar104);
    auVar236._0_4_ = fVar246 + auVar95._0_4_;
    auVar236._4_4_ = fVar250 + auVar95._4_4_;
    auVar236._8_4_ = fVar251 + auVar95._8_4_;
    auVar236._12_4_ = fVar252 + auVar95._12_4_;
    auVar236._16_4_ = fVar229 + auVar95._16_4_;
    auVar236._20_4_ = fVar230 + auVar95._20_4_;
    auVar236._24_4_ = fVar217 + auVar95._24_4_;
    auVar236._28_4_ = fVar14 + auVar95._28_4_;
    auVar80 = vmaxps_avx(auVar95,auVar236);
    auVar81 = vminps_avx(auVar95,auVar236);
    auVar105 = vpermt2ps_avx512vl(auVar95,_DAT_01feed00,auVar96);
    auVar106 = vpermt2ps_avx512vl(auVar32,_DAT_01feed00,auVar96);
    auVar249 = ZEXT3264(auVar106);
    auVar107 = vpermt2ps_avx512vl(auVar33,_DAT_01feed00,auVar96);
    auVar121 = ZEXT1632(auVar71);
    auVar108 = vpermt2ps_avx512vl(auVar34,_DAT_01feed00,auVar121);
    auVar95 = vpermt2ps_avx512vl(auVar35,_DAT_01feed00,auVar121);
    auVar109 = vsubps_avx512vl(auVar105,auVar95);
    auVar95 = vsubps_avx(auVar102,auVar99);
    auVar245 = ZEXT3264(auVar95);
    auVar96 = vsubps_avx(auVar103,auVar100);
    auVar97 = vsubps_avx(auVar104,auVar98);
    auVar110 = vmulps_avx512vl(auVar96,auVar34);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar33,auVar97);
    auVar111 = vmulps_avx512vl(auVar97,auVar32);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar34,auVar95);
    auVar112 = vmulps_avx512vl(auVar95,auVar33);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar32,auVar96);
    auVar112 = vmulps_avx512vl(auVar112,auVar112);
    auVar111 = vfmadd231ps_avx512vl(auVar112,auVar111,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar110,auVar110);
    auVar111 = vmulps_avx512vl(auVar97,auVar97);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar96,auVar96);
    auVar112 = vfmadd231ps_avx512vl(auVar111,auVar95,auVar95);
    auVar111 = vrcp14ps_avx512vl(auVar112);
    auVar113 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar114 = vfnmadd213ps_avx512vl(auVar111,auVar112,auVar113);
    auVar111 = vfmadd132ps_avx512vl(auVar114,auVar111,auVar111);
    auVar110 = vmulps_avx512vl(auVar110,auVar111);
    auVar114 = vmulps_avx512vl(auVar96,auVar108);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar107,auVar97);
    auVar115 = vmulps_avx512vl(auVar97,auVar106);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar108,auVar95);
    auVar116 = vmulps_avx512vl(auVar95,auVar107);
    auVar116 = vfmsub231ps_avx512vl(auVar116,auVar106,auVar96);
    auVar116 = vmulps_avx512vl(auVar116,auVar116);
    auVar115 = vfmadd231ps_avx512vl(auVar116,auVar115,auVar115);
    auVar114 = vfmadd231ps_avx512vl(auVar115,auVar114,auVar114);
    auVar111 = vmulps_avx512vl(auVar114,auVar111);
    auVar110 = vmaxps_avx512vl(auVar110,auVar111);
    auVar110 = vsqrtps_avx512vl(auVar110);
    auVar111 = vmaxps_avx512vl(auVar109,auVar105);
    auVar80 = vmaxps_avx512vl(auVar80,auVar111);
    auVar114 = vaddps_avx512vl(auVar110,auVar80);
    auVar80 = vminps_avx512vl(auVar109,auVar105);
    auVar80 = vminps_avx(auVar81,auVar80);
    auVar80 = vsubps_avx512vl(auVar80,auVar110);
    auVar109._8_4_ = 0x3f800002;
    auVar109._0_8_ = 0x3f8000023f800002;
    auVar109._12_4_ = 0x3f800002;
    auVar109._16_4_ = 0x3f800002;
    auVar109._20_4_ = 0x3f800002;
    auVar109._24_4_ = 0x3f800002;
    auVar109._28_4_ = 0x3f800002;
    auVar81 = vmulps_avx512vl(auVar114,auVar109);
    auVar110._8_4_ = 0x3f7ffffc;
    auVar110._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar110._12_4_ = 0x3f7ffffc;
    auVar110._16_4_ = 0x3f7ffffc;
    auVar110._20_4_ = 0x3f7ffffc;
    auVar110._24_4_ = 0x3f7ffffc;
    auVar110._28_4_ = 0x3f7ffffc;
    auVar80 = vmulps_avx512vl(auVar80,auVar110);
    auVar81 = vmulps_avx512vl(auVar81,auVar81);
    auVar105 = vrsqrt14ps_avx512vl(auVar112);
    auVar111._8_4_ = 0xbf000000;
    auVar111._0_8_ = 0xbf000000bf000000;
    auVar111._12_4_ = 0xbf000000;
    auVar111._16_4_ = 0xbf000000;
    auVar111._20_4_ = 0xbf000000;
    auVar111._24_4_ = 0xbf000000;
    auVar111._28_4_ = 0xbf000000;
    auVar109 = vmulps_avx512vl(auVar112,auVar111);
    fVar246 = auVar105._0_4_;
    fVar250 = auVar105._4_4_;
    fVar251 = auVar105._8_4_;
    fVar252 = auVar105._12_4_;
    fVar229 = auVar105._16_4_;
    fVar230 = auVar105._20_4_;
    fVar217 = auVar105._24_4_;
    auVar36._4_4_ = fVar250 * fVar250 * fVar250 * auVar109._4_4_;
    auVar36._0_4_ = fVar246 * fVar246 * fVar246 * auVar109._0_4_;
    auVar36._8_4_ = fVar251 * fVar251 * fVar251 * auVar109._8_4_;
    auVar36._12_4_ = fVar252 * fVar252 * fVar252 * auVar109._12_4_;
    auVar36._16_4_ = fVar229 * fVar229 * fVar229 * auVar109._16_4_;
    auVar36._20_4_ = fVar230 * fVar230 * fVar230 * auVar109._20_4_;
    auVar36._24_4_ = fVar217 * fVar217 * fVar217 * auVar109._24_4_;
    auVar36._28_4_ = auVar114._28_4_;
    auVar112._8_4_ = 0x3fc00000;
    auVar112._0_8_ = 0x3fc000003fc00000;
    auVar112._12_4_ = 0x3fc00000;
    auVar112._16_4_ = 0x3fc00000;
    auVar112._20_4_ = 0x3fc00000;
    auVar112._24_4_ = 0x3fc00000;
    auVar112._28_4_ = 0x3fc00000;
    auVar105 = vfmadd231ps_avx512vl(auVar36,auVar105,auVar112);
    auVar109 = vmulps_avx512vl(auVar95,auVar105);
    auVar110 = vmulps_avx512vl(auVar96,auVar105);
    auVar111 = vmulps_avx512vl(auVar97,auVar105);
    auVar112 = vsubps_avx512vl(auVar121,auVar99);
    auVar115 = vsubps_avx512vl(auVar121,auVar100);
    auVar116 = vsubps_avx512vl(auVar121,auVar98);
    auVar114 = vmulps_avx512vl(local_820,auVar116);
    auVar114 = vfmadd231ps_avx512vl(auVar114,local_800,auVar115);
    auVar114 = vfmadd231ps_avx512vl(auVar114,local_7e0,auVar112);
    auVar117 = vmulps_avx512vl(auVar116,auVar116);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar115,auVar115);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar112,auVar112);
    auVar118 = vmulps_avx512vl(local_820,auVar111);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar110,local_800);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar109,local_7e0);
    auVar111 = vmulps_avx512vl(auVar116,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar115,auVar110);
    auVar109 = vfmadd231ps_avx512vl(auVar110,auVar112,auVar109);
    auVar110 = vmulps_avx512vl(auVar118,auVar118);
    auVar111 = vsubps_avx512vl(local_560,auVar110);
    auVar119 = vmulps_avx512vl(auVar118,auVar109);
    auVar114 = vsubps_avx512vl(auVar114,auVar119);
    auVar119 = vaddps_avx512vl(auVar114,auVar114);
    auVar114 = vmulps_avx512vl(auVar109,auVar109);
    local_9e0 = vsubps_avx512vl(auVar117,auVar114);
    auVar81 = vsubps_avx512vl(local_9e0,auVar81);
    auVar117 = vmulps_avx512vl(auVar119,auVar119);
    auVar114._8_4_ = 0x40800000;
    auVar114._0_8_ = 0x4080000040800000;
    auVar114._12_4_ = 0x40800000;
    auVar114._16_4_ = 0x40800000;
    auVar114._20_4_ = 0x40800000;
    auVar114._24_4_ = 0x40800000;
    auVar114._28_4_ = 0x40800000;
    auVar114 = vmulps_avx512vl(auVar111,auVar114);
    auVar120 = vmulps_avx512vl(auVar114,auVar81);
    auVar120 = vsubps_avx512vl(auVar117,auVar120);
    uVar66 = vcmpps_avx512vl(auVar120,auVar121,5);
    bVar52 = (byte)uVar66;
    if (bVar52 == 0) {
LAB_01cb2fff:
      auVar164 = ZEXT3264(auVar113);
    }
    else {
      local_7c0._0_32_ = auVar117;
      auVar120 = vsqrtps_avx512vl(auVar120);
      auVar121 = vaddps_avx512vl(auVar111,auVar111);
      auVar122 = vrcp14ps_avx512vl(auVar121);
      auVar113 = vfnmadd213ps_avx512vl(auVar122,auVar121,auVar113);
      auVar113 = vfmadd132ps_avx512vl(auVar113,auVar122,auVar122);
      _local_860 = vxorps_avx512vl(auVar119,auVar101);
      auVar101 = vsubps_avx512vl(_local_860,auVar120);
      auVar101 = vmulps_avx512vl(auVar101,auVar113);
      auVar120 = vsubps_avx512vl(auVar120,auVar119);
      local_840 = vmulps_avx512vl(auVar120,auVar113);
      auVar120 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar113 = vblendmps_avx512vl(auVar120,auVar101);
      auVar123._0_4_ =
           (uint)(bVar52 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar120._0_4_;
      bVar65 = (bool)((byte)(uVar66 >> 1) & 1);
      auVar123._4_4_ = (uint)bVar65 * auVar113._4_4_ | (uint)!bVar65 * auVar120._4_4_;
      bVar65 = (bool)((byte)(uVar66 >> 2) & 1);
      auVar123._8_4_ = (uint)bVar65 * auVar113._8_4_ | (uint)!bVar65 * auVar120._8_4_;
      bVar65 = (bool)((byte)(uVar66 >> 3) & 1);
      auVar123._12_4_ = (uint)bVar65 * auVar113._12_4_ | (uint)!bVar65 * auVar120._12_4_;
      bVar65 = (bool)((byte)(uVar66 >> 4) & 1);
      auVar123._16_4_ = (uint)bVar65 * auVar113._16_4_ | (uint)!bVar65 * auVar120._16_4_;
      bVar65 = (bool)((byte)(uVar66 >> 5) & 1);
      auVar123._20_4_ = (uint)bVar65 * auVar113._20_4_ | (uint)!bVar65 * auVar120._20_4_;
      bVar65 = (bool)((byte)(uVar66 >> 6) & 1);
      auVar123._24_4_ = (uint)bVar65 * auVar113._24_4_ | (uint)!bVar65 * auVar120._24_4_;
      bVar65 = SUB81(uVar66 >> 7,0);
      auVar123._28_4_ = (uint)bVar65 * auVar113._28_4_ | (uint)!bVar65 * auVar120._28_4_;
      auVar120 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar113 = vblendmps_avx512vl(auVar120,local_840);
      auVar124._0_4_ =
           (uint)(bVar52 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar120._0_4_;
      bVar65 = (bool)((byte)(uVar66 >> 1) & 1);
      auVar124._4_4_ = (uint)bVar65 * auVar113._4_4_ | (uint)!bVar65 * auVar120._4_4_;
      bVar65 = (bool)((byte)(uVar66 >> 2) & 1);
      auVar124._8_4_ = (uint)bVar65 * auVar113._8_4_ | (uint)!bVar65 * auVar120._8_4_;
      bVar65 = (bool)((byte)(uVar66 >> 3) & 1);
      auVar124._12_4_ = (uint)bVar65 * auVar113._12_4_ | (uint)!bVar65 * auVar120._12_4_;
      bVar65 = (bool)((byte)(uVar66 >> 4) & 1);
      auVar124._16_4_ = (uint)bVar65 * auVar113._16_4_ | (uint)!bVar65 * auVar120._16_4_;
      bVar65 = (bool)((byte)(uVar66 >> 5) & 1);
      auVar124._20_4_ = (uint)bVar65 * auVar113._20_4_ | (uint)!bVar65 * auVar120._20_4_;
      bVar65 = (bool)((byte)(uVar66 >> 6) & 1);
      auVar124._24_4_ = (uint)bVar65 * auVar113._24_4_ | (uint)!bVar65 * auVar120._24_4_;
      bVar65 = SUB81(uVar66 >> 7,0);
      auVar124._28_4_ = (uint)bVar65 * auVar113._28_4_ | (uint)!bVar65 * auVar120._28_4_;
      auVar120 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar110,auVar120);
      local_880 = vmaxps_avx512vl(local_580,auVar120);
      auVar25._8_4_ = 0x36000000;
      auVar25._0_8_ = 0x3600000036000000;
      auVar25._12_4_ = 0x36000000;
      auVar25._16_4_ = 0x36000000;
      auVar25._20_4_ = 0x36000000;
      auVar25._24_4_ = 0x36000000;
      auVar25._28_4_ = 0x36000000;
      local_8a0 = vmulps_avx512vl(local_880,auVar25);
      vandps_avx512vl(auVar111,auVar120);
      uVar59 = vcmpps_avx512vl(local_8a0,local_8a0,1);
      uVar66 = uVar66 & uVar59;
      bVar57 = (byte)uVar66;
      if (bVar57 != 0) {
        uVar59 = vcmpps_avx512vl(auVar81,_DAT_01faff00,2);
        auVar81 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar110 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar111 = vblendmps_avx512vl(auVar81,auVar110);
        bVar58 = (byte)uVar59;
        uVar68 = (uint)(bVar58 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar58 & 1) * local_8a0._0_4_;
        bVar65 = (bool)((byte)(uVar59 >> 1) & 1);
        uVar67 = (uint)bVar65 * auVar111._4_4_ | (uint)!bVar65 * local_8a0._4_4_;
        bVar65 = (bool)((byte)(uVar59 >> 2) & 1);
        uVar141 = (uint)bVar65 * auVar111._8_4_ | (uint)!bVar65 * local_8a0._8_4_;
        bVar65 = (bool)((byte)(uVar59 >> 3) & 1);
        uVar142 = (uint)bVar65 * auVar111._12_4_ | (uint)!bVar65 * local_8a0._12_4_;
        bVar65 = (bool)((byte)(uVar59 >> 4) & 1);
        uVar143 = (uint)bVar65 * auVar111._16_4_ | (uint)!bVar65 * local_8a0._16_4_;
        bVar65 = (bool)((byte)(uVar59 >> 5) & 1);
        uVar144 = (uint)bVar65 * auVar111._20_4_ | (uint)!bVar65 * local_8a0._20_4_;
        bVar65 = (bool)((byte)(uVar59 >> 6) & 1);
        uVar145 = (uint)bVar65 * auVar111._24_4_ | (uint)!bVar65 * local_8a0._24_4_;
        bVar65 = SUB81(uVar59 >> 7,0);
        uVar146 = (uint)bVar65 * auVar111._28_4_ | (uint)!bVar65 * local_8a0._28_4_;
        auVar123._0_4_ = (bVar57 & 1) * uVar68 | !(bool)(bVar57 & 1) * auVar123._0_4_;
        bVar65 = (bool)((byte)(uVar66 >> 1) & 1);
        auVar123._4_4_ = bVar65 * uVar67 | !bVar65 * auVar123._4_4_;
        bVar65 = (bool)((byte)(uVar66 >> 2) & 1);
        auVar123._8_4_ = bVar65 * uVar141 | !bVar65 * auVar123._8_4_;
        bVar65 = (bool)((byte)(uVar66 >> 3) & 1);
        auVar123._12_4_ = bVar65 * uVar142 | !bVar65 * auVar123._12_4_;
        bVar65 = (bool)((byte)(uVar66 >> 4) & 1);
        auVar123._16_4_ = bVar65 * uVar143 | !bVar65 * auVar123._16_4_;
        bVar65 = (bool)((byte)(uVar66 >> 5) & 1);
        auVar123._20_4_ = bVar65 * uVar144 | !bVar65 * auVar123._20_4_;
        bVar65 = (bool)((byte)(uVar66 >> 6) & 1);
        auVar123._24_4_ = bVar65 * uVar145 | !bVar65 * auVar123._24_4_;
        bVar65 = SUB81(uVar66 >> 7,0);
        auVar123._28_4_ = bVar65 * uVar146 | !bVar65 * auVar123._28_4_;
        auVar81 = vblendmps_avx512vl(auVar110,auVar81);
        bVar65 = (bool)((byte)(uVar59 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar59 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar59 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar59 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar59 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar59 >> 6) & 1);
        bVar11 = SUB81(uVar59 >> 7,0);
        auVar124._0_4_ =
             (uint)(bVar57 & 1) *
             ((uint)(bVar58 & 1) * auVar81._0_4_ | !(bool)(bVar58 & 1) * uVar68) |
             !(bool)(bVar57 & 1) * auVar124._0_4_;
        bVar5 = (bool)((byte)(uVar66 >> 1) & 1);
        auVar124._4_4_ =
             (uint)bVar5 * ((uint)bVar65 * auVar81._4_4_ | !bVar65 * uVar67) |
             !bVar5 * auVar124._4_4_;
        bVar65 = (bool)((byte)(uVar66 >> 2) & 1);
        auVar124._8_4_ =
             (uint)bVar65 * ((uint)bVar6 * auVar81._8_4_ | !bVar6 * uVar141) |
             !bVar65 * auVar124._8_4_;
        bVar65 = (bool)((byte)(uVar66 >> 3) & 1);
        auVar124._12_4_ =
             (uint)bVar65 * ((uint)bVar7 * auVar81._12_4_ | !bVar7 * uVar142) |
             !bVar65 * auVar124._12_4_;
        bVar65 = (bool)((byte)(uVar66 >> 4) & 1);
        auVar124._16_4_ =
             (uint)bVar65 * ((uint)bVar8 * auVar81._16_4_ | !bVar8 * uVar143) |
             !bVar65 * auVar124._16_4_;
        bVar65 = (bool)((byte)(uVar66 >> 5) & 1);
        auVar124._20_4_ =
             (uint)bVar65 * ((uint)bVar9 * auVar81._20_4_ | !bVar9 * uVar144) |
             !bVar65 * auVar124._20_4_;
        bVar65 = (bool)((byte)(uVar66 >> 6) & 1);
        auVar124._24_4_ =
             (uint)bVar65 * ((uint)bVar10 * auVar81._24_4_ | !bVar10 * uVar145) |
             !bVar65 * auVar124._24_4_;
        bVar65 = SUB81(uVar66 >> 7,0);
        auVar124._28_4_ =
             (uint)bVar65 * ((uint)bVar11 * auVar81._28_4_ | !bVar11 * uVar146) |
             !bVar65 * auVar124._28_4_;
        bVar52 = (~bVar57 | bVar58) & bVar52;
      }
      if ((bVar52 & 0x7f) == 0) {
        auVar164 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
      }
      else {
        auVar81 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar108 = vxorps_avx512vl(auVar108,auVar81);
        auVar106 = vxorps_avx512vl(auVar106,auVar81);
        uVar68 = *(uint *)(ray + k * 4 + 0x200);
        auVar107 = vxorps_avx512vl(auVar107,auVar81);
        auVar71 = vsubss_avx512f(ZEXT416(uVar68),ZEXT416((uint)local_920._0_4_));
        auVar110 = vbroadcastss_avx512vl(auVar71);
        auVar110 = vminps_avx512vl(auVar110,auVar124);
        auVar50._4_4_ = fStack_5fc;
        auVar50._0_4_ = local_600;
        auVar50._8_4_ = fStack_5f8;
        auVar50._12_4_ = fStack_5f4;
        auVar50._16_4_ = fStack_5f0;
        auVar50._20_4_ = fStack_5ec;
        auVar50._24_4_ = fStack_5e8;
        auVar50._28_4_ = fStack_5e4;
        auVar111 = vmaxps_avx512vl(auVar50,auVar123);
        auVar116 = vmulps_avx512vl(auVar34,auVar116);
        auVar115 = vfmadd213ps_avx512vl(auVar115,auVar33,auVar116);
        auVar71 = vfmadd213ps_fma(auVar112,auVar32,auVar115);
        auVar112 = vmulps_avx512vl(local_820,auVar34);
        auVar112 = vfmadd231ps_avx512vl(auVar112,local_800,auVar33);
        auVar77 = vfmadd231ps_fma(auVar112,local_7e0,auVar32);
        auVar112 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(ZEXT1632(auVar77),auVar112);
        auVar115 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar15 = vcmpps_avx512vl(auVar112,auVar115,1);
        auVar116 = vxorps_avx512vl(ZEXT1632(auVar71),auVar81);
        auVar120 = vrcp14ps_avx512vl(ZEXT1632(auVar77));
        auVar228 = ZEXT1632(auVar77);
        auVar125 = vxorps_avx512vl(auVar228,auVar81);
        auVar113 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar126 = vfnmadd213ps_avx512vl(auVar120,auVar228,auVar113);
        auVar71 = vfmadd132ps_fma(auVar126,auVar120,auVar120);
        fVar246 = auVar71._0_4_ * auVar116._0_4_;
        fVar250 = auVar71._4_4_ * auVar116._4_4_;
        auVar37._4_4_ = fVar250;
        auVar37._0_4_ = fVar246;
        fVar251 = auVar71._8_4_ * auVar116._8_4_;
        auVar37._8_4_ = fVar251;
        fVar252 = auVar71._12_4_ * auVar116._12_4_;
        auVar37._12_4_ = fVar252;
        fVar229 = auVar116._16_4_ * 0.0;
        auVar37._16_4_ = fVar229;
        fVar230 = auVar116._20_4_ * 0.0;
        auVar37._20_4_ = fVar230;
        fVar217 = auVar116._24_4_ * 0.0;
        auVar37._24_4_ = fVar217;
        auVar37._28_4_ = auVar116._28_4_;
        uVar16 = vcmpps_avx512vl(auVar228,auVar125,1);
        bVar57 = (byte)uVar15 | (byte)uVar16;
        auVar260._8_4_ = 0xff800000;
        auVar260._0_8_ = 0xff800000ff800000;
        auVar260._12_4_ = 0xff800000;
        auVar260._16_4_ = 0xff800000;
        auVar260._20_4_ = 0xff800000;
        auVar260._24_4_ = 0xff800000;
        auVar260._28_4_ = 0xff800000;
        auVar120 = vblendmps_avx512vl(auVar37,auVar260);
        auVar127._0_4_ = (uint)(bVar57 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar57 & 1) * -0x800000
        ;
        bVar65 = (bool)(bVar57 >> 1 & 1);
        auVar127._4_4_ = (uint)bVar65 * auVar120._4_4_ | (uint)!bVar65 * -0x800000;
        bVar65 = (bool)(bVar57 >> 2 & 1);
        auVar127._8_4_ = (uint)bVar65 * auVar120._8_4_ | (uint)!bVar65 * -0x800000;
        bVar65 = (bool)(bVar57 >> 3 & 1);
        auVar127._12_4_ = (uint)bVar65 * auVar120._12_4_ | (uint)!bVar65 * -0x800000;
        bVar65 = (bool)(bVar57 >> 4 & 1);
        auVar127._16_4_ = (uint)bVar65 * auVar120._16_4_ | (uint)!bVar65 * -0x800000;
        bVar65 = (bool)(bVar57 >> 5 & 1);
        auVar127._20_4_ = (uint)bVar65 * auVar120._20_4_ | (uint)!bVar65 * -0x800000;
        bVar65 = (bool)(bVar57 >> 6 & 1);
        auVar127._24_4_ = (uint)bVar65 * auVar120._24_4_ | (uint)!bVar65 * -0x800000;
        auVar127._28_4_ =
             (uint)(bVar57 >> 7) * auVar120._28_4_ | (uint)!(bool)(bVar57 >> 7) * -0x800000;
        auVar120 = vmaxps_avx512vl(auVar111,auVar127);
        auVar261 = ZEXT3264(auVar120);
        uVar16 = vcmpps_avx512vl(auVar228,auVar125,6);
        bVar57 = (byte)uVar15 | (byte)uVar16;
        auVar128._0_4_ = (uint)(bVar57 & 1) * 0x7f800000 | (uint)!(bool)(bVar57 & 1) * (int)fVar246;
        bVar65 = (bool)(bVar57 >> 1 & 1);
        auVar128._4_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar250;
        bVar65 = (bool)(bVar57 >> 2 & 1);
        auVar128._8_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar251;
        bVar65 = (bool)(bVar57 >> 3 & 1);
        auVar128._12_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar252;
        bVar65 = (bool)(bVar57 >> 4 & 1);
        auVar128._16_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar229;
        bVar65 = (bool)(bVar57 >> 5 & 1);
        auVar128._20_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar230;
        bVar65 = (bool)(bVar57 >> 6 & 1);
        auVar128._24_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar217;
        auVar128._28_4_ =
             (uint)(bVar57 >> 7) * 0x7f800000 | (uint)!(bool)(bVar57 >> 7) * auVar116._28_4_;
        auVar110 = vminps_avx512vl(auVar110,auVar128);
        auVar71 = vxorps_avx512vl(auVar111._0_16_,auVar111._0_16_);
        auVar102 = vsubps_avx512vl(ZEXT1632(auVar71),auVar102);
        auVar103 = vsubps_avx512vl(ZEXT1632(auVar71),auVar103);
        auVar111 = ZEXT1632(auVar71);
        auVar104 = vsubps_avx512vl(auVar111,auVar104);
        auVar104 = vmulps_avx512vl(auVar104,auVar108);
        auVar103 = vfmadd231ps_avx512vl(auVar104,auVar107,auVar103);
        auVar102 = vfmadd231ps_avx512vl(auVar103,auVar106,auVar102);
        auVar103 = vmulps_avx512vl(local_820,auVar108);
        auVar103 = vfmadd231ps_avx512vl(auVar103,local_800,auVar107);
        auVar103 = vfmadd231ps_avx512vl(auVar103,local_7e0,auVar106);
        vandps_avx512vl(auVar103,auVar112);
        uVar15 = vcmpps_avx512vl(auVar103,auVar115,1);
        auVar102 = vxorps_avx512vl(auVar102,auVar81);
        auVar104 = vrcp14ps_avx512vl(auVar103);
        auVar81 = vxorps_avx512vl(auVar103,auVar81);
        auVar257 = ZEXT3264(auVar81);
        auVar106 = vfnmadd213ps_avx512vl(auVar104,auVar103,auVar113);
        auVar71 = vfmadd132ps_fma(auVar106,auVar104,auVar104);
        fVar246 = auVar71._0_4_ * auVar102._0_4_;
        fVar250 = auVar71._4_4_ * auVar102._4_4_;
        auVar38._4_4_ = fVar250;
        auVar38._0_4_ = fVar246;
        fVar251 = auVar71._8_4_ * auVar102._8_4_;
        auVar38._8_4_ = fVar251;
        fVar252 = auVar71._12_4_ * auVar102._12_4_;
        auVar38._12_4_ = fVar252;
        fVar229 = auVar102._16_4_ * 0.0;
        auVar38._16_4_ = fVar229;
        fVar230 = auVar102._20_4_ * 0.0;
        auVar38._20_4_ = fVar230;
        fVar217 = auVar102._24_4_ * 0.0;
        auVar38._24_4_ = fVar217;
        auVar38._28_4_ = auVar102._28_4_;
        uVar16 = vcmpps_avx512vl(auVar103,auVar81,1);
        bVar57 = (byte)uVar15 | (byte)uVar16;
        auVar26._8_4_ = 0xff800000;
        auVar26._0_8_ = 0xff800000ff800000;
        auVar26._12_4_ = 0xff800000;
        auVar26._16_4_ = 0xff800000;
        auVar26._20_4_ = 0xff800000;
        auVar26._24_4_ = 0xff800000;
        auVar26._28_4_ = 0xff800000;
        auVar106 = vblendmps_avx512vl(auVar38,auVar26);
        auVar129._0_4_ =
             (uint)(bVar57 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar104._0_4_;
        bVar65 = (bool)(bVar57 >> 1 & 1);
        auVar129._4_4_ = (uint)bVar65 * auVar106._4_4_ | (uint)!bVar65 * auVar104._4_4_;
        bVar65 = (bool)(bVar57 >> 2 & 1);
        auVar129._8_4_ = (uint)bVar65 * auVar106._8_4_ | (uint)!bVar65 * auVar104._8_4_;
        bVar65 = (bool)(bVar57 >> 3 & 1);
        auVar129._12_4_ = (uint)bVar65 * auVar106._12_4_ | (uint)!bVar65 * auVar104._12_4_;
        bVar65 = (bool)(bVar57 >> 4 & 1);
        auVar129._16_4_ = (uint)bVar65 * auVar106._16_4_ | (uint)!bVar65 * auVar104._16_4_;
        bVar65 = (bool)(bVar57 >> 5 & 1);
        auVar129._20_4_ = (uint)bVar65 * auVar106._20_4_ | (uint)!bVar65 * auVar104._20_4_;
        bVar65 = (bool)(bVar57 >> 6 & 1);
        auVar129._24_4_ = (uint)bVar65 * auVar106._24_4_ | (uint)!bVar65 * auVar104._24_4_;
        auVar129._28_4_ =
             (uint)(bVar57 >> 7) * auVar106._28_4_ | (uint)!(bool)(bVar57 >> 7) * auVar104._28_4_;
        _local_a00 = vmaxps_avx(auVar120,auVar129);
        auVar249 = ZEXT3264(_local_a00);
        uVar16 = vcmpps_avx512vl(auVar103,auVar81,6);
        bVar57 = (byte)uVar15 | (byte)uVar16;
        auVar130._0_4_ = (uint)(bVar57 & 1) * 0x7f800000 | (uint)!(bool)(bVar57 & 1) * (int)fVar246;
        bVar65 = (bool)(bVar57 >> 1 & 1);
        auVar130._4_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar250;
        bVar65 = (bool)(bVar57 >> 2 & 1);
        auVar130._8_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar251;
        bVar65 = (bool)(bVar57 >> 3 & 1);
        auVar130._12_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar252;
        bVar65 = (bool)(bVar57 >> 4 & 1);
        auVar130._16_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar229;
        bVar65 = (bool)(bVar57 >> 5 & 1);
        auVar130._20_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar230;
        bVar65 = (bool)(bVar57 >> 6 & 1);
        auVar130._24_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar217;
        auVar130._28_4_ =
             (uint)(bVar57 >> 7) * 0x7f800000 | (uint)!(bool)(bVar57 >> 7) * auVar102._28_4_;
        local_680 = vminps_avx(auVar110,auVar130);
        auVar254 = ZEXT3264(local_680);
        uVar15 = vcmpps_avx512vl(_local_a00,local_680,2);
        bVar52 = bVar52 & 0x7f & (byte)uVar15;
        if (bVar52 == 0) goto LAB_01cb2fff;
        auVar81 = vmaxps_avx512vl(auVar111,auVar80);
        auVar80 = vfmadd213ps_avx512vl(auVar101,auVar118,auVar109);
        auVar80 = vmulps_avx512vl(auVar105,auVar80);
        auVar101 = vfmadd213ps_avx512vl(local_840,auVar118,auVar109);
        auVar39._4_4_ = auVar105._4_4_ * auVar101._4_4_;
        auVar39._0_4_ = auVar105._0_4_ * auVar101._0_4_;
        auVar39._8_4_ = auVar105._8_4_ * auVar101._8_4_;
        auVar39._12_4_ = auVar105._12_4_ * auVar101._12_4_;
        auVar39._16_4_ = auVar105._16_4_ * auVar101._16_4_;
        auVar39._20_4_ = auVar105._20_4_ * auVar101._20_4_;
        auVar39._24_4_ = auVar105._24_4_ * auVar101._24_4_;
        auVar39._28_4_ = auVar129._28_4_;
        auVar80 = vminps_avx512vl(auVar80,auVar113);
        auVar101 = ZEXT832(0) << 0x20;
        auVar80 = vmaxps_avx(auVar80,ZEXT832(0) << 0x20);
        auVar102 = vminps_avx512vl(auVar39,auVar113);
        auVar40._4_4_ = (auVar80._4_4_ + 1.0) * 0.125;
        auVar40._0_4_ = (auVar80._0_4_ + 0.0) * 0.125;
        auVar40._8_4_ = (auVar80._8_4_ + 2.0) * 0.125;
        auVar40._12_4_ = (auVar80._12_4_ + 3.0) * 0.125;
        auVar40._16_4_ = (auVar80._16_4_ + 4.0) * 0.125;
        auVar40._20_4_ = (auVar80._20_4_ + 5.0) * 0.125;
        auVar40._24_4_ = (auVar80._24_4_ + 6.0) * 0.125;
        auVar40._28_4_ = auVar80._28_4_ + 7.0;
        auVar71 = vfmadd213ps_fma(auVar40,auVar157,auVar234);
        local_520 = ZEXT1632(auVar71);
        auVar80 = vmaxps_avx(auVar102,ZEXT832(0) << 0x20);
        auVar41._4_4_ = (auVar80._4_4_ + 1.0) * 0.125;
        auVar41._0_4_ = (auVar80._0_4_ + 0.0) * 0.125;
        auVar41._8_4_ = (auVar80._8_4_ + 2.0) * 0.125;
        auVar41._12_4_ = (auVar80._12_4_ + 3.0) * 0.125;
        auVar41._16_4_ = (auVar80._16_4_ + 4.0) * 0.125;
        auVar41._20_4_ = (auVar80._20_4_ + 5.0) * 0.125;
        auVar41._24_4_ = (auVar80._24_4_ + 6.0) * 0.125;
        auVar41._28_4_ = auVar80._28_4_ + 7.0;
        auVar71 = vfmadd213ps_fma(auVar41,auVar157,auVar234);
        local_540 = ZEXT1632(auVar71);
        auVar42._4_4_ = auVar81._4_4_ * auVar81._4_4_;
        auVar42._0_4_ = auVar81._0_4_ * auVar81._0_4_;
        auVar42._8_4_ = auVar81._8_4_ * auVar81._8_4_;
        auVar42._12_4_ = auVar81._12_4_ * auVar81._12_4_;
        auVar42._16_4_ = auVar81._16_4_ * auVar81._16_4_;
        auVar42._20_4_ = auVar81._20_4_ * auVar81._20_4_;
        auVar42._24_4_ = auVar81._24_4_ * auVar81._24_4_;
        auVar42._28_4_ = auVar81._28_4_;
        auVar80 = vsubps_avx(local_9e0,auVar42);
        local_ac0 = auVar114._0_4_;
        fStack_abc = auVar114._4_4_;
        fStack_ab8 = auVar114._8_4_;
        fStack_ab4 = auVar114._12_4_;
        fStack_ab0 = auVar114._16_4_;
        fStack_aac = auVar114._20_4_;
        fStack_aa8 = auVar114._24_4_;
        auVar43._4_4_ = auVar80._4_4_ * fStack_abc;
        auVar43._0_4_ = auVar80._0_4_ * local_ac0;
        auVar43._8_4_ = auVar80._8_4_ * fStack_ab8;
        auVar43._12_4_ = auVar80._12_4_ * fStack_ab4;
        auVar43._16_4_ = auVar80._16_4_ * fStack_ab0;
        auVar43._20_4_ = auVar80._20_4_ * fStack_aac;
        auVar43._24_4_ = auVar80._24_4_ * fStack_aa8;
        auVar43._28_4_ = auVar81._28_4_;
        auVar81 = vsubps_avx(auVar117,auVar43);
        uVar15 = vcmpps_avx512vl(auVar81,ZEXT832(0) << 0x20,5);
        bVar57 = (byte)uVar15;
        if (bVar57 == 0) {
          bVar57 = 0;
          auVar95 = ZEXT832(0) << 0x20;
          auVar164 = ZEXT864(0) << 0x20;
          auVar81 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar102 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar255 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar131._8_4_ = 0x7f800000;
          auVar131._0_8_ = 0x7f8000007f800000;
          auVar131._12_4_ = 0x7f800000;
          auVar131._16_4_ = 0x7f800000;
          auVar131._20_4_ = 0x7f800000;
          auVar131._24_4_ = 0x7f800000;
          auVar131._28_4_ = 0x7f800000;
          auVar132._8_4_ = 0xff800000;
          auVar132._0_8_ = 0xff800000ff800000;
          auVar132._12_4_ = 0xff800000;
          auVar132._16_4_ = 0xff800000;
          auVar132._20_4_ = 0xff800000;
          auVar132._24_4_ = 0xff800000;
          auVar132._28_4_ = 0xff800000;
        }
        else {
          uVar66 = vcmpps_avx512vl(auVar81,auVar111,5);
          auVar81 = vsqrtps_avx(auVar81);
          auVar101 = vfnmadd213ps_avx512vl(auVar121,auVar122,auVar113);
          auVar103 = vfmadd132ps_avx512vl(auVar101,auVar122,auVar122);
          auVar101 = vsubps_avx(_local_860,auVar81);
          auVar104 = vmulps_avx512vl(auVar101,auVar103);
          auVar81 = vsubps_avx512vl(auVar81,auVar119);
          auVar103 = vmulps_avx512vl(auVar81,auVar103);
          auVar81 = vfmadd213ps_avx512vl(auVar118,auVar104,auVar109);
          auVar44._4_4_ = auVar105._4_4_ * auVar81._4_4_;
          auVar44._0_4_ = auVar105._0_4_ * auVar81._0_4_;
          auVar44._8_4_ = auVar105._8_4_ * auVar81._8_4_;
          auVar44._12_4_ = auVar105._12_4_ * auVar81._12_4_;
          auVar44._16_4_ = auVar105._16_4_ * auVar81._16_4_;
          auVar44._20_4_ = auVar105._20_4_ * auVar81._20_4_;
          auVar44._24_4_ = auVar105._24_4_ * auVar81._24_4_;
          auVar44._28_4_ = auVar102._28_4_;
          auVar81 = vmulps_avx512vl(local_7e0,auVar104);
          auVar101 = vmulps_avx512vl(local_800,auVar104);
          auVar106 = vmulps_avx512vl(local_820,auVar104);
          auVar102 = vfmadd213ps_avx512vl(auVar95,auVar44,auVar99);
          auVar81 = vsubps_avx512vl(auVar81,auVar102);
          auVar102 = vfmadd213ps_avx512vl(auVar96,auVar44,auVar100);
          auVar102 = vsubps_avx512vl(auVar101,auVar102);
          auVar71 = vfmadd213ps_fma(auVar44,auVar97,auVar98);
          auVar101 = vsubps_avx(auVar106,ZEXT1632(auVar71));
          auVar255 = auVar101._0_28_;
          auVar101 = vfmadd213ps_avx512vl(auVar118,auVar103,auVar109);
          auVar105 = vmulps_avx512vl(auVar105,auVar101);
          auVar101 = vmulps_avx512vl(local_7e0,auVar103);
          auVar106 = vmulps_avx512vl(local_800,auVar103);
          auVar107 = vmulps_avx512vl(local_820,auVar103);
          auVar71 = vfmadd213ps_fma(auVar95,auVar105,auVar99);
          auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar71));
          auVar71 = vfmadd213ps_fma(auVar96,auVar105,auVar100);
          auVar95 = vsubps_avx512vl(auVar106,ZEXT1632(auVar71));
          auVar71 = vfmadd213ps_fma(auVar97,auVar105,auVar98);
          auVar96 = vsubps_avx512vl(auVar107,ZEXT1632(auVar71));
          auVar164 = ZEXT3264(auVar96);
          auVar158._8_4_ = 0x7f800000;
          auVar158._0_8_ = 0x7f8000007f800000;
          auVar158._12_4_ = 0x7f800000;
          auVar158._16_4_ = 0x7f800000;
          auVar158._20_4_ = 0x7f800000;
          auVar158._24_4_ = 0x7f800000;
          auVar158._28_4_ = 0x7f800000;
          auVar96 = vblendmps_avx512vl(auVar158,auVar104);
          bVar65 = (bool)((byte)uVar66 & 1);
          auVar131._0_4_ = (uint)bVar65 * auVar96._0_4_ | (uint)!bVar65 * 0x7f800000;
          bVar65 = (bool)((byte)(uVar66 >> 1) & 1);
          auVar131._4_4_ = (uint)bVar65 * auVar96._4_4_ | (uint)!bVar65 * 0x7f800000;
          bVar65 = (bool)((byte)(uVar66 >> 2) & 1);
          auVar131._8_4_ = (uint)bVar65 * auVar96._8_4_ | (uint)!bVar65 * 0x7f800000;
          bVar65 = (bool)((byte)(uVar66 >> 3) & 1);
          auVar131._12_4_ = (uint)bVar65 * auVar96._12_4_ | (uint)!bVar65 * 0x7f800000;
          bVar65 = (bool)((byte)(uVar66 >> 4) & 1);
          auVar131._16_4_ = (uint)bVar65 * auVar96._16_4_ | (uint)!bVar65 * 0x7f800000;
          bVar65 = (bool)((byte)(uVar66 >> 5) & 1);
          auVar131._20_4_ = (uint)bVar65 * auVar96._20_4_ | (uint)!bVar65 * 0x7f800000;
          bVar65 = (bool)((byte)(uVar66 >> 6) & 1);
          auVar131._24_4_ = (uint)bVar65 * auVar96._24_4_ | (uint)!bVar65 * 0x7f800000;
          bVar65 = SUB81(uVar66 >> 7,0);
          auVar131._28_4_ = (uint)bVar65 * auVar96._28_4_ | (uint)!bVar65 * 0x7f800000;
          auVar210._8_4_ = 0xff800000;
          auVar210._0_8_ = 0xff800000ff800000;
          auVar210._12_4_ = 0xff800000;
          auVar210._16_4_ = 0xff800000;
          auVar210._20_4_ = 0xff800000;
          auVar210._24_4_ = 0xff800000;
          auVar210._28_4_ = 0xff800000;
          auVar96 = vblendmps_avx512vl(auVar210,auVar103);
          bVar65 = (bool)((byte)uVar66 & 1);
          auVar132._0_4_ = (uint)bVar65 * auVar96._0_4_ | (uint)!bVar65 * -0x800000;
          bVar65 = (bool)((byte)(uVar66 >> 1) & 1);
          auVar132._4_4_ = (uint)bVar65 * auVar96._4_4_ | (uint)!bVar65 * -0x800000;
          bVar65 = (bool)((byte)(uVar66 >> 2) & 1);
          auVar132._8_4_ = (uint)bVar65 * auVar96._8_4_ | (uint)!bVar65 * -0x800000;
          bVar65 = (bool)((byte)(uVar66 >> 3) & 1);
          auVar132._12_4_ = (uint)bVar65 * auVar96._12_4_ | (uint)!bVar65 * -0x800000;
          bVar65 = (bool)((byte)(uVar66 >> 4) & 1);
          auVar132._16_4_ = (uint)bVar65 * auVar96._16_4_ | (uint)!bVar65 * -0x800000;
          bVar65 = (bool)((byte)(uVar66 >> 5) & 1);
          auVar132._20_4_ = (uint)bVar65 * auVar96._20_4_ | (uint)!bVar65 * -0x800000;
          bVar65 = (bool)((byte)(uVar66 >> 6) & 1);
          auVar132._24_4_ = (uint)bVar65 * auVar96._24_4_ | (uint)!bVar65 * -0x800000;
          bVar65 = SUB81(uVar66 >> 7,0);
          auVar132._28_4_ = (uint)bVar65 * auVar96._28_4_ | (uint)!bVar65 * -0x800000;
          auVar27._8_4_ = 0x36000000;
          auVar27._0_8_ = 0x3600000036000000;
          auVar27._12_4_ = 0x36000000;
          auVar27._16_4_ = 0x36000000;
          auVar27._20_4_ = 0x36000000;
          auVar27._24_4_ = 0x36000000;
          auVar27._28_4_ = 0x36000000;
          auVar96 = vmulps_avx512vl(local_880,auVar27);
          uVar59 = vcmpps_avx512vl(auVar96,local_8a0,0xe);
          uVar66 = uVar66 & uVar59;
          bVar58 = (byte)uVar66;
          if (bVar58 != 0) {
            uVar59 = vcmpps_avx512vl(auVar80,ZEXT1632(ZEXT816(0) << 0x40),2);
            auVar244._8_4_ = 0x7f800000;
            auVar244._0_8_ = 0x7f8000007f800000;
            auVar244._12_4_ = 0x7f800000;
            auVar244._16_4_ = 0x7f800000;
            auVar244._20_4_ = 0x7f800000;
            auVar244._24_4_ = 0x7f800000;
            auVar244._28_4_ = 0x7f800000;
            auVar248._8_4_ = 0xff800000;
            auVar248._0_8_ = 0xff800000ff800000;
            auVar248._12_4_ = 0xff800000;
            auVar248._16_4_ = 0xff800000;
            auVar248._20_4_ = 0xff800000;
            auVar248._24_4_ = 0xff800000;
            auVar248._28_4_ = 0xff800000;
            auVar80 = vblendmps_avx512vl(auVar244,auVar248);
            bVar60 = (byte)uVar59;
            uVar67 = (uint)(bVar60 & 1) * auVar80._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar96._0_4_;
            bVar65 = (bool)((byte)(uVar59 >> 1) & 1);
            uVar141 = (uint)bVar65 * auVar80._4_4_ | (uint)!bVar65 * auVar96._4_4_;
            bVar65 = (bool)((byte)(uVar59 >> 2) & 1);
            uVar142 = (uint)bVar65 * auVar80._8_4_ | (uint)!bVar65 * auVar96._8_4_;
            bVar65 = (bool)((byte)(uVar59 >> 3) & 1);
            uVar143 = (uint)bVar65 * auVar80._12_4_ | (uint)!bVar65 * auVar96._12_4_;
            bVar65 = (bool)((byte)(uVar59 >> 4) & 1);
            uVar144 = (uint)bVar65 * auVar80._16_4_ | (uint)!bVar65 * auVar96._16_4_;
            bVar65 = (bool)((byte)(uVar59 >> 5) & 1);
            uVar145 = (uint)bVar65 * auVar80._20_4_ | (uint)!bVar65 * auVar96._20_4_;
            bVar65 = (bool)((byte)(uVar59 >> 6) & 1);
            uVar146 = (uint)bVar65 * auVar80._24_4_ | (uint)!bVar65 * auVar96._24_4_;
            bVar65 = SUB81(uVar59 >> 7,0);
            uVar147 = (uint)bVar65 * auVar80._28_4_ | (uint)!bVar65 * auVar96._28_4_;
            auVar131._0_4_ = (bVar58 & 1) * uVar67 | !(bool)(bVar58 & 1) * auVar131._0_4_;
            bVar65 = (bool)((byte)(uVar66 >> 1) & 1);
            auVar131._4_4_ = bVar65 * uVar141 | !bVar65 * auVar131._4_4_;
            bVar65 = (bool)((byte)(uVar66 >> 2) & 1);
            auVar131._8_4_ = bVar65 * uVar142 | !bVar65 * auVar131._8_4_;
            bVar65 = (bool)((byte)(uVar66 >> 3) & 1);
            auVar131._12_4_ = bVar65 * uVar143 | !bVar65 * auVar131._12_4_;
            bVar65 = (bool)((byte)(uVar66 >> 4) & 1);
            auVar131._16_4_ = bVar65 * uVar144 | !bVar65 * auVar131._16_4_;
            bVar65 = (bool)((byte)(uVar66 >> 5) & 1);
            auVar131._20_4_ = bVar65 * uVar145 | !bVar65 * auVar131._20_4_;
            bVar65 = (bool)((byte)(uVar66 >> 6) & 1);
            auVar131._24_4_ = bVar65 * uVar146 | !bVar65 * auVar131._24_4_;
            bVar65 = SUB81(uVar66 >> 7,0);
            auVar131._28_4_ = bVar65 * uVar147 | !bVar65 * auVar131._28_4_;
            auVar80 = vblendmps_avx512vl(auVar248,auVar244);
            bVar65 = (bool)((byte)(uVar59 >> 1) & 1);
            bVar6 = (bool)((byte)(uVar59 >> 2) & 1);
            bVar7 = (bool)((byte)(uVar59 >> 3) & 1);
            bVar8 = (bool)((byte)(uVar59 >> 4) & 1);
            bVar9 = (bool)((byte)(uVar59 >> 5) & 1);
            bVar10 = (bool)((byte)(uVar59 >> 6) & 1);
            bVar11 = SUB81(uVar59 >> 7,0);
            auVar132._0_4_ =
                 (uint)(bVar58 & 1) *
                 ((uint)(bVar60 & 1) * auVar80._0_4_ | !(bool)(bVar60 & 1) * uVar67) |
                 !(bool)(bVar58 & 1) * auVar132._0_4_;
            bVar5 = (bool)((byte)(uVar66 >> 1) & 1);
            auVar132._4_4_ =
                 (uint)bVar5 * ((uint)bVar65 * auVar80._4_4_ | !bVar65 * uVar141) |
                 !bVar5 * auVar132._4_4_;
            bVar65 = (bool)((byte)(uVar66 >> 2) & 1);
            auVar132._8_4_ =
                 (uint)bVar65 * ((uint)bVar6 * auVar80._8_4_ | !bVar6 * uVar142) |
                 !bVar65 * auVar132._8_4_;
            bVar65 = (bool)((byte)(uVar66 >> 3) & 1);
            auVar132._12_4_ =
                 (uint)bVar65 * ((uint)bVar7 * auVar80._12_4_ | !bVar7 * uVar143) |
                 !bVar65 * auVar132._12_4_;
            bVar65 = (bool)((byte)(uVar66 >> 4) & 1);
            auVar132._16_4_ =
                 (uint)bVar65 * ((uint)bVar8 * auVar80._16_4_ | !bVar8 * uVar144) |
                 !bVar65 * auVar132._16_4_;
            bVar65 = (bool)((byte)(uVar66 >> 5) & 1);
            auVar132._20_4_ =
                 (uint)bVar65 * ((uint)bVar9 * auVar80._20_4_ | !bVar9 * uVar145) |
                 !bVar65 * auVar132._20_4_;
            bVar65 = (bool)((byte)(uVar66 >> 6) & 1);
            auVar132._24_4_ =
                 (uint)bVar65 * ((uint)bVar10 * auVar80._24_4_ | !bVar10 * uVar146) |
                 !bVar65 * auVar132._24_4_;
            bVar65 = SUB81(uVar66 >> 7,0);
            auVar132._28_4_ =
                 (uint)bVar65 * ((uint)bVar11 * auVar80._28_4_ | !bVar11 * uVar147) |
                 !bVar65 * auVar132._28_4_;
            bVar57 = (~bVar58 | bVar60) & bVar57;
          }
        }
        auVar261 = ZEXT3264(local_820);
        auVar245._0_4_ = local_820._0_4_ * auVar164._0_4_;
        auVar245._4_4_ = local_820._4_4_ * auVar164._4_4_;
        auVar245._8_4_ = local_820._8_4_ * auVar164._8_4_;
        auVar245._12_4_ = local_820._12_4_ * auVar164._12_4_;
        auVar245._16_4_ = local_820._16_4_ * auVar164._16_4_;
        auVar245._20_4_ = local_820._20_4_ * auVar164._20_4_;
        auVar245._28_36_ = auVar164._28_36_;
        auVar245._24_4_ = local_820._24_4_ * auVar164._24_4_;
        auVar249 = ZEXT3264(local_800);
        auVar71 = vfmadd231ps_fma(auVar245._0_32_,local_800,auVar95);
        auVar245 = ZEXT3264(local_7e0);
        auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),local_7e0,auVar101);
        auVar241._8_4_ = 0x7fffffff;
        auVar241._0_8_ = 0x7fffffff7fffffff;
        auVar241._12_4_ = 0x7fffffff;
        auVar241._16_4_ = 0x7fffffff;
        auVar241._20_4_ = 0x7fffffff;
        auVar241._24_4_ = 0x7fffffff;
        auVar241._28_4_ = 0x7fffffff;
        auVar80 = vandps_avx(ZEXT1632(auVar71),auVar241);
        auVar257 = ZEXT3264(_local_a00);
        _local_440 = _local_a00;
        auVar240._8_4_ = 0x3e99999a;
        auVar240._0_8_ = 0x3e99999a3e99999a;
        auVar240._12_4_ = 0x3e99999a;
        auVar240._16_4_ = 0x3e99999a;
        auVar240._20_4_ = 0x3e99999a;
        auVar240._24_4_ = 0x3e99999a;
        auVar240._28_4_ = 0x3e99999a;
        uVar15 = vcmpps_avx512vl(auVar80,auVar240,1);
        local_720._0_2_ = (short)uVar15;
        local_6a0 = vmaxps_avx(_local_a00,auVar132);
        auVar80 = vminps_avx(local_680,auVar131);
        uVar15 = vcmpps_avx512vl(_local_a00,auVar80,2);
        bVar58 = (byte)uVar15 & bVar52;
        uVar16 = vcmpps_avx512vl(local_6a0,local_680,2);
        if ((bVar52 & ((byte)uVar16 | (byte)uVar15)) == 0) {
          auVar164 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                                                                                                                  
                                                  0x3f8000003f800000)))))));
        }
        else {
          auVar45._4_4_ = local_820._4_4_ * auVar255._4_4_;
          auVar45._0_4_ = local_820._0_4_ * auVar255._0_4_;
          auVar45._8_4_ = local_820._8_4_ * auVar255._8_4_;
          auVar45._12_4_ = local_820._12_4_ * auVar255._12_4_;
          auVar45._16_4_ = local_820._16_4_ * auVar255._16_4_;
          auVar45._20_4_ = local_820._20_4_ * auVar255._20_4_;
          auVar45._24_4_ = local_820._24_4_ * auVar255._24_4_;
          auVar45._28_4_ = auVar80._28_4_;
          auVar71 = vfmadd213ps_fma(auVar102,local_800,auVar45);
          auVar71 = vfmadd213ps_fma(auVar81,local_7e0,ZEXT1632(auVar71));
          auVar80 = vandps_avx(ZEXT1632(auVar71),auVar241);
          uVar15 = vcmpps_avx512vl(auVar80,auVar240,1);
          bVar60 = (byte)uVar15 | ~bVar57;
          auVar160._8_4_ = 2;
          auVar160._0_8_ = 0x200000002;
          auVar160._12_4_ = 2;
          auVar160._16_4_ = 2;
          auVar160._20_4_ = 2;
          auVar160._24_4_ = 2;
          auVar160._28_4_ = 2;
          auVar28._8_4_ = 3;
          auVar28._0_8_ = 0x300000003;
          auVar28._12_4_ = 3;
          auVar28._16_4_ = 3;
          auVar28._20_4_ = 3;
          auVar28._24_4_ = 3;
          auVar28._28_4_ = 3;
          auVar80 = vpblendmd_avx512vl(auVar160,auVar28);
          local_640._0_4_ = (uint)(bVar60 & 1) * auVar80._0_4_ | (uint)!(bool)(bVar60 & 1) * 2;
          bVar65 = (bool)(bVar60 >> 1 & 1);
          local_640._4_4_ = (uint)bVar65 * auVar80._4_4_ | (uint)!bVar65 * 2;
          bVar65 = (bool)(bVar60 >> 2 & 1);
          local_640._8_4_ = (uint)bVar65 * auVar80._8_4_ | (uint)!bVar65 * 2;
          bVar65 = (bool)(bVar60 >> 3 & 1);
          local_640._12_4_ = (uint)bVar65 * auVar80._12_4_ | (uint)!bVar65 * 2;
          bVar65 = (bool)(bVar60 >> 4 & 1);
          local_640._16_4_ = (uint)bVar65 * auVar80._16_4_ | (uint)!bVar65 * 2;
          bVar65 = (bool)(bVar60 >> 5 & 1);
          local_640._20_4_ = (uint)bVar65 * auVar80._20_4_ | (uint)!bVar65 * 2;
          bVar65 = (bool)(bVar60 >> 6 & 1);
          local_640._24_4_ = (uint)bVar65 * auVar80._24_4_ | (uint)!bVar65 * 2;
          local_640._28_4_ = (uint)(bVar60 >> 7) * auVar80._28_4_ | (uint)!(bool)(bVar60 >> 7) * 2;
          local_6c0 = vpbroadcastd_avx512vl();
          uVar15 = vpcmpd_avx512vl(local_6c0,local_640,5);
          bVar60 = (byte)uVar15 & bVar58;
          auVar164 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                                                                                                                  
                                                  0x3f8000003f800000)))))));
          if (bVar60 == 0) {
            auVar162._4_4_ = uVar68;
            auVar162._0_4_ = uVar68;
            auVar162._8_4_ = uVar68;
            auVar162._12_4_ = uVar68;
            auVar162._16_4_ = uVar68;
            auVar162._20_4_ = uVar68;
            auVar162._24_4_ = uVar68;
            auVar162._28_4_ = uVar68;
            auVar80 = local_6a0;
          }
          else {
            local_660 = local_6a0;
            auVar77 = vminps_avx(local_940._0_16_,local_980._0_16_);
            auVar71 = vmaxps_avx(local_940._0_16_,local_980._0_16_);
            auVar69 = vminps_avx(local_960._0_16_,local_9a0._0_16_);
            auVar1 = vminps_avx(auVar77,auVar69);
            auVar77 = vmaxps_avx(local_960._0_16_,local_9a0._0_16_);
            auVar69 = vmaxps_avx(auVar71,auVar77);
            auVar190._8_4_ = 0x7fffffff;
            auVar190._0_8_ = 0x7fffffff7fffffff;
            auVar190._12_4_ = 0x7fffffff;
            auVar71 = vandps_avx(auVar1,auVar190);
            auVar77 = vandps_avx(auVar69,auVar190);
            auVar71 = vmaxps_avx(auVar71,auVar77);
            auVar77 = vmovshdup_avx(auVar71);
            auVar77 = vmaxss_avx(auVar77,auVar71);
            auVar71 = vshufpd_avx(auVar71,auVar71,1);
            auVar71 = vmaxss_avx(auVar71,auVar77);
            fVar246 = auVar71._0_4_ * 1.9073486e-06;
            local_910 = vshufps_avx(auVar69,auVar69,0xff);
            local_700 = (float)local_a00._0_4_ + fVar165;
            fStack_6fc = (float)local_a00._4_4_ + fVar165;
            fStack_6f8 = fStack_9f8 + fVar165;
            fStack_6f4 = fStack_9f4 + fVar165;
            fStack_6f0 = fStack_9f0 + fVar165;
            fStack_6ec = fStack_9ec + fVar165;
            fStack_6e8 = fStack_9e8 + fVar165;
            fStack_6e4 = fStack_9e4 + fVar165;
            do {
              auVar161._8_4_ = 0x7f800000;
              auVar161._0_8_ = 0x7f8000007f800000;
              auVar161._12_4_ = 0x7f800000;
              auVar161._16_4_ = 0x7f800000;
              auVar161._20_4_ = 0x7f800000;
              auVar161._24_4_ = 0x7f800000;
              auVar161._28_4_ = 0x7f800000;
              auVar80 = vblendmps_avx512vl(auVar161,_local_a00);
              auVar134._0_4_ =
                   (uint)(bVar60 & 1) * auVar80._0_4_ | (uint)!(bool)(bVar60 & 1) * 0x7f800000;
              bVar65 = (bool)(bVar60 >> 1 & 1);
              auVar134._4_4_ = (uint)bVar65 * auVar80._4_4_ | (uint)!bVar65 * 0x7f800000;
              bVar65 = (bool)(bVar60 >> 2 & 1);
              auVar134._8_4_ = (uint)bVar65 * auVar80._8_4_ | (uint)!bVar65 * 0x7f800000;
              bVar65 = (bool)(bVar60 >> 3 & 1);
              auVar134._12_4_ = (uint)bVar65 * auVar80._12_4_ | (uint)!bVar65 * 0x7f800000;
              bVar65 = (bool)(bVar60 >> 4 & 1);
              auVar134._16_4_ = (uint)bVar65 * auVar80._16_4_ | (uint)!bVar65 * 0x7f800000;
              bVar65 = (bool)(bVar60 >> 5 & 1);
              auVar134._20_4_ = (uint)bVar65 * auVar80._20_4_ | (uint)!bVar65 * 0x7f800000;
              auVar134._24_4_ =
                   (uint)(bVar60 >> 6) * auVar80._24_4_ | (uint)!(bool)(bVar60 >> 6) * 0x7f800000;
              auVar134._28_4_ = 0x7f800000;
              auVar80 = vshufps_avx(auVar134,auVar134,0xb1);
              auVar80 = vminps_avx(auVar134,auVar80);
              auVar81 = vshufpd_avx(auVar80,auVar80,5);
              auVar80 = vminps_avx(auVar80,auVar81);
              auVar81 = vpermpd_avx2(auVar80,0x4e);
              auVar80 = vminps_avx(auVar80,auVar81);
              uVar15 = vcmpps_avx512vl(auVar134,auVar80,0);
              bVar53 = (byte)uVar15 & bVar60;
              bVar54 = bVar60;
              if (bVar53 != 0) {
                bVar54 = bVar53;
              }
              iVar18 = 0;
              for (uVar68 = (uint)bVar54; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000) {
                iVar18 = iVar18 + 1;
              }
              uVar68 = *(uint *)(local_520 + (uint)(iVar18 << 2));
              uVar67 = *(uint *)(local_440 + (uint)(iVar18 << 2));
              fVar250 = auVar13._0_4_;
              if ((float)local_9c0._0_4_ < 0.0) {
                fVar250 = sqrtf((float)local_9c0._0_4_);
              }
              auVar71 = vinsertps_avx(ZEXT416(uVar67),ZEXT416(uVar68),0x10);
              auVar254 = ZEXT1664(auVar71);
              bVar65 = true;
              uVar66 = 0;
              do {
                uVar172 = auVar254._0_4_;
                auVar150._4_4_ = uVar172;
                auVar150._0_4_ = uVar172;
                auVar150._8_4_ = uVar172;
                auVar150._12_4_ = uVar172;
                auVar71 = vfmadd132ps_fma(auVar150,ZEXT816(0) << 0x40,local_9b0);
                auVar77 = vmovshdup_avx(auVar254._0_16_);
                fVar237 = auVar77._0_4_;
                fVar262 = 1.0 - fVar237;
                fVar252 = fVar262 * fVar262 * fVar262;
                fVar217 = fVar237 * fVar237 * fVar237;
                auVar69 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar252),
                                          ZEXT416((uint)fVar217));
                fVar251 = fVar237 * fVar262;
                auVar231 = ZEXT416((uint)fVar262);
                auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar251 * fVar237 * 6.0)),
                                          ZEXT416((uint)(fVar251 * fVar262)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar217),
                                         ZEXT416((uint)fVar252));
                auVar70 = vfmadd231ss_fma(ZEXT416((uint)(fVar251 * fVar262 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar251 * fVar237)));
                fVar252 = fVar252 * 0.16666667;
                fVar229 = (auVar69._0_4_ + auVar72._0_4_) * 0.16666667;
                fVar230 = (auVar1._0_4_ + auVar70._0_4_) * 0.16666667;
                fVar217 = fVar217 * 0.16666667;
                auVar191._0_4_ = fVar217 * (float)local_9a0._0_4_;
                auVar191._4_4_ = fVar217 * (float)local_9a0._4_4_;
                auVar191._8_4_ = fVar217 * fStack_998;
                auVar191._12_4_ = fVar217 * fStack_994;
                auVar232._4_4_ = fVar230;
                auVar232._0_4_ = fVar230;
                auVar232._8_4_ = fVar230;
                auVar232._12_4_ = fVar230;
                auVar69 = vfmadd132ps_fma(auVar232,auVar191,local_960._0_16_);
                auVar192._4_4_ = fVar229;
                auVar192._0_4_ = fVar229;
                auVar192._8_4_ = fVar229;
                auVar192._12_4_ = fVar229;
                auVar69 = vfmadd132ps_fma(auVar192,auVar69,local_980._0_16_);
                auVar174._4_4_ = fVar252;
                auVar174._0_4_ = fVar252;
                auVar174._8_4_ = fVar252;
                auVar174._12_4_ = fVar252;
                auVar69 = vfmadd132ps_fma(auVar174,auVar69,local_940._0_16_);
                local_840._0_16_ = auVar69;
                auVar69 = vsubps_avx(auVar71,auVar69);
                auVar71 = vdpps_avx(auVar69,auVar69,0x7f);
                local_9e0._0_16_ = auVar71;
                local_7c0 = auVar254;
                if (auVar71._0_4_ < 0.0) {
                  auVar164._0_4_ = sqrtf(auVar71._0_4_);
                  auVar164._4_60_ = extraout_var;
                  auVar71 = auVar164._0_16_;
                }
                else {
                  auVar71 = vsqrtss_avx(auVar71,auVar71);
                }
                local_860._4_4_ = fVar262;
                local_860._0_4_ = fVar262;
                fStack_858 = fVar262;
                fStack_854 = fVar262;
                auVar72 = vfnmsub213ss_fma(auVar77,auVar77,ZEXT416((uint)(fVar251 * 4.0)));
                auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar251 * 4.0)),auVar231,auVar231);
                fVar251 = fVar262 * -fVar262 * 0.5;
                fVar252 = auVar72._0_4_ * 0.5;
                fVar229 = auVar1._0_4_ * 0.5;
                fVar230 = fVar237 * fVar237 * 0.5;
                auVar218._0_4_ = fVar230 * (float)local_9a0._0_4_;
                auVar218._4_4_ = fVar230 * (float)local_9a0._4_4_;
                auVar218._8_4_ = fVar230 * fStack_998;
                auVar218._12_4_ = fVar230 * fStack_994;
                auVar175._4_4_ = fVar229;
                auVar175._0_4_ = fVar229;
                auVar175._8_4_ = fVar229;
                auVar175._12_4_ = fVar229;
                auVar1 = vfmadd132ps_fma(auVar175,auVar218,local_960._0_16_);
                auVar193._4_4_ = fVar252;
                auVar193._0_4_ = fVar252;
                auVar193._8_4_ = fVar252;
                auVar193._12_4_ = fVar252;
                auVar1 = vfmadd132ps_fma(auVar193,auVar1,local_980._0_16_);
                auVar258._4_4_ = fVar251;
                auVar258._0_4_ = fVar251;
                auVar258._8_4_ = fVar251;
                auVar258._12_4_ = fVar251;
                auVar1 = vfmadd132ps_fma(auVar258,auVar1,local_940._0_16_);
                local_880._0_16_ = vdpps_avx(auVar1,auVar1,0x7f);
                auVar46._12_4_ = 0;
                auVar46._0_12_ = ZEXT812(0);
                fVar251 = local_880._0_4_;
                auVar72 = vrsqrt14ss_avx512f(auVar46 << 0x20,ZEXT416((uint)fVar251));
                fVar252 = auVar72._0_4_;
                local_8a0._0_16_ = vrcp14ss_avx512f(auVar46 << 0x20,ZEXT416((uint)fVar251));
                auVar72 = vfnmadd213ss_fma(local_8a0._0_16_,local_880._0_16_,ZEXT416(0x40000000));
                uVar68 = auVar71._0_4_;
                if (fVar251 < -fVar251) {
                  fVar229 = sqrtf(fVar251);
                  auVar71 = ZEXT416(uVar68);
                }
                else {
                  auVar70 = vsqrtss_avx(local_880._0_16_,local_880._0_16_);
                  fVar229 = auVar70._0_4_;
                }
                fVar251 = fVar252 * 1.5 + fVar251 * -0.5 * fVar252 * fVar252 * fVar252;
                auVar151._0_4_ = auVar1._0_4_ * fVar251;
                auVar151._4_4_ = auVar1._4_4_ * fVar251;
                auVar151._8_4_ = auVar1._8_4_ * fVar251;
                auVar151._12_4_ = auVar1._12_4_ * fVar251;
                auVar70 = vdpps_avx(auVar69,auVar151,0x7f);
                fVar217 = auVar71._0_4_;
                fVar252 = auVar70._0_4_;
                auVar152._0_4_ = fVar252 * fVar252;
                auVar152._4_4_ = auVar70._4_4_ * auVar70._4_4_;
                auVar152._8_4_ = auVar70._8_4_ * auVar70._8_4_;
                auVar152._12_4_ = auVar70._12_4_ * auVar70._12_4_;
                auVar76 = vsubps_avx(local_9e0._0_16_,auVar152);
                fVar230 = auVar76._0_4_;
                auVar176._4_12_ = ZEXT812(0) << 0x20;
                auVar176._0_4_ = fVar230;
                auVar73 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar176);
                auVar74 = vmulss_avx512f(auVar73,ZEXT416(0x3fc00000));
                auVar75 = vmulss_avx512f(auVar76,ZEXT416(0xbf000000));
                if (fVar230 < 0.0) {
                  local_8d0._0_4_ = fVar229;
                  local_8f0._0_4_ = auVar74._0_4_;
                  local_900._4_4_ = fVar251;
                  local_900._0_4_ = fVar251;
                  fStack_8f8 = fVar251;
                  fStack_8f4 = fVar251;
                  local_8e0 = auVar73;
                  fVar230 = sqrtf(fVar230);
                  auVar75 = ZEXT416(auVar75._0_4_);
                  auVar74 = ZEXT416((uint)local_8f0._0_4_);
                  auVar71 = ZEXT416(uVar68);
                  auVar73 = local_8e0;
                  fVar251 = (float)local_900._0_4_;
                  fVar262 = (float)local_900._4_4_;
                  fVar237 = fStack_8f8;
                  fVar263 = fStack_8f4;
                  fVar229 = (float)local_8d0._0_4_;
                }
                else {
                  auVar76 = vsqrtss_avx(auVar76,auVar76);
                  fVar230 = auVar76._0_4_;
                  fVar262 = fVar251;
                  fVar237 = fVar251;
                  fVar263 = fVar251;
                }
                auVar261 = ZEXT1664(auVar1);
                auVar257 = ZEXT1664(local_9e0._0_16_);
                auVar76 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar231,auVar77);
                auVar231 = vfmadd213ss_fma(auVar77,SUB6416(ZEXT464(0xc0000000),0),auVar231);
                auVar79 = local_7c0._0_16_;
                auVar77 = vshufps_avx(auVar79,auVar79,0x55);
                auVar194._0_4_ = auVar77._0_4_ * (float)local_9a0._0_4_;
                auVar194._4_4_ = auVar77._4_4_ * (float)local_9a0._4_4_;
                auVar194._8_4_ = auVar77._8_4_ * fStack_998;
                auVar194._12_4_ = auVar77._12_4_ * fStack_994;
                auVar219._0_4_ = auVar231._0_4_;
                auVar219._4_4_ = auVar219._0_4_;
                auVar219._8_4_ = auVar219._0_4_;
                auVar219._12_4_ = auVar219._0_4_;
                auVar77 = vfmadd132ps_fma(auVar219,auVar194,local_960._0_16_);
                auVar177._0_4_ = auVar76._0_4_;
                auVar177._4_4_ = auVar177._0_4_;
                auVar177._8_4_ = auVar177._0_4_;
                auVar177._12_4_ = auVar177._0_4_;
                auVar77 = vfmadd132ps_fma(auVar177,auVar77,local_980._0_16_);
                auVar77 = vfmadd132ps_fma(_local_860,auVar77,local_940._0_16_);
                auVar178._0_4_ = auVar77._0_4_ * (float)local_880._0_4_;
                auVar178._4_4_ = auVar77._4_4_ * (float)local_880._0_4_;
                auVar178._8_4_ = auVar77._8_4_ * (float)local_880._0_4_;
                auVar178._12_4_ = auVar77._12_4_ * (float)local_880._0_4_;
                auVar77 = vdpps_avx(auVar1,auVar77,0x7f);
                fVar189 = auVar77._0_4_;
                auVar195._0_4_ = auVar1._0_4_ * fVar189;
                auVar195._4_4_ = auVar1._4_4_ * fVar189;
                auVar195._8_4_ = auVar1._8_4_ * fVar189;
                auVar195._12_4_ = auVar1._12_4_ * fVar189;
                auVar77 = vsubps_avx(auVar178,auVar195);
                fVar189 = auVar72._0_4_ * (float)local_8a0._0_4_;
                auVar231 = vmaxss_avx(ZEXT416((uint)fVar246),
                                      ZEXT416((uint)(local_7c0._0_4_ * fVar250 * 1.9073486e-06)));
                auVar19._8_4_ = 0x80000000;
                auVar19._0_8_ = 0x8000000080000000;
                auVar19._12_4_ = 0x80000000;
                auVar76 = vxorps_avx512vl(auVar1,auVar19);
                auVar196._0_4_ = fVar251 * auVar77._0_4_ * fVar189;
                auVar196._4_4_ = fVar262 * auVar77._4_4_ * fVar189;
                auVar196._8_4_ = fVar237 * auVar77._8_4_ * fVar189;
                auVar196._12_4_ = fVar263 * auVar77._12_4_ * fVar189;
                auVar77 = vdpps_avx(auVar76,auVar151,0x7f);
                auVar72 = vfmadd213ss_fma(auVar71,ZEXT416((uint)fVar246),auVar231);
                auVar71 = vdpps_avx(auVar69,auVar196,0x7f);
                auVar78 = vfmadd213ss_fma(ZEXT416((uint)(fVar217 + 1.0)),
                                          ZEXT416((uint)(fVar246 / fVar229)),auVar72);
                fVar251 = auVar77._0_4_ + auVar71._0_4_;
                auVar71 = vdpps_avx(local_9b0,auVar151,0x7f);
                auVar77 = vdpps_avx(auVar69,auVar76,0x7f);
                auVar72 = vmulss_avx512f(auVar75,auVar73);
                auVar74 = vaddss_avx512f(auVar74,ZEXT416((uint)(auVar72._0_4_ *
                                                               auVar73._0_4_ * auVar73._0_4_)));
                auVar72 = vdpps_avx(auVar69,local_9b0,0x7f);
                auVar73 = vfnmadd231ss_fma(auVar77,auVar70,ZEXT416((uint)fVar251));
                auVar72 = vfnmadd231ss_fma(auVar72,auVar70,auVar71);
                auVar77 = vpermilps_avx(local_840._0_16_,0xff);
                fVar230 = fVar230 - auVar77._0_4_;
                auVar76 = vshufps_avx(auVar1,auVar1,0xff);
                auVar77 = vfmsub213ss_fma(auVar73,auVar74,auVar76);
                auVar247._8_4_ = 0x80000000;
                auVar247._0_8_ = 0x8000000080000000;
                auVar247._12_4_ = 0x80000000;
                auVar249 = ZEXT1664(auVar247);
                auVar242._0_8_ = auVar77._0_8_ ^ 0x8000000080000000;
                auVar242._8_4_ = auVar77._8_4_ ^ 0x80000000;
                auVar242._12_4_ = auVar77._12_4_ ^ 0x80000000;
                auVar72 = ZEXT416((uint)(auVar72._0_4_ * auVar74._0_4_));
                auVar73 = vfmsub231ss_fma(ZEXT416((uint)(auVar71._0_4_ * auVar77._0_4_)),
                                          ZEXT416((uint)fVar251),auVar72);
                auVar77 = vinsertps_avx(auVar242,auVar72,0x1c);
                auVar238._0_8_ = auVar71._0_8_ ^ 0x8000000080000000;
                auVar238._8_4_ = auVar71._8_4_ ^ 0x80000000;
                auVar238._12_4_ = auVar71._12_4_ ^ 0x80000000;
                auVar72 = vinsertps_avx(ZEXT416((uint)fVar251),auVar238,0x10);
                auVar220._0_4_ = auVar73._0_4_;
                auVar220._4_4_ = auVar220._0_4_;
                auVar220._8_4_ = auVar220._0_4_;
                auVar220._12_4_ = auVar220._0_4_;
                auVar71 = vdivps_avx(auVar77,auVar220);
                auVar77 = vdivps_avx(auVar72,auVar220);
                auVar221._0_4_ = fVar252 * auVar71._0_4_ + fVar230 * auVar77._0_4_;
                auVar221._4_4_ = fVar252 * auVar71._4_4_ + fVar230 * auVar77._4_4_;
                auVar221._8_4_ = fVar252 * auVar71._8_4_ + fVar230 * auVar77._8_4_;
                auVar221._12_4_ = fVar252 * auVar71._12_4_ + fVar230 * auVar77._12_4_;
                auVar71 = vsubps_avx(auVar79,auVar221);
                auVar254 = ZEXT1664(auVar71);
                auVar20._8_4_ = 0x7fffffff;
                auVar20._0_8_ = 0x7fffffff7fffffff;
                auVar20._12_4_ = 0x7fffffff;
                auVar77 = vandps_avx512vl(auVar70,auVar20);
                if (auVar77._0_4_ < auVar78._0_4_) {
                  auVar77 = vfmadd231ss_fma(ZEXT416((uint)(auVar78._0_4_ + auVar231._0_4_)),
                                            local_910,ZEXT416(0x36000000));
                  auVar21._8_4_ = 0x7fffffff;
                  auVar21._0_8_ = 0x7fffffff7fffffff;
                  auVar21._12_4_ = 0x7fffffff;
                  auVar72 = vandps_avx512vl(ZEXT416((uint)fVar230),auVar21);
                  if (auVar72._0_4_ < auVar77._0_4_) {
                    fVar250 = auVar71._0_4_ + (float)local_920._0_4_;
                    auVar164 = ZEXT3264(CONCAT428(0x3f800000,
                                                  CONCAT424(0x3f800000,
                                                            CONCAT420(0x3f800000,
                                                                      CONCAT416(0x3f800000,
                                                                                CONCAT412(0x3f800000
                                                                                          ,CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                    if (fVar250 < fVar148) {
LAB_01cb3b13:
                      bVar54 = 0;
                      goto LAB_01cb3b3d;
                    }
                    fVar251 = *(float *)(ray + k * 4 + 0x200);
                    if (fVar250 <= fVar251) {
                      auVar77 = vmovshdup_avx(auVar71);
                      bVar54 = 0;
                      if ((auVar77._0_4_ < 0.0) || (1.0 < auVar77._0_4_)) goto LAB_01cb3b3d;
                      auVar222._0_12_ = ZEXT812(0);
                      auVar222._12_4_ = 0;
                      auVar197._4_8_ = auVar222._4_8_;
                      auVar197._0_4_ = local_9e0._0_4_;
                      auVar197._12_4_ = 0;
                      auVar77 = vrsqrt14ss_avx512f(auVar222,auVar197);
                      fVar252 = auVar77._0_4_;
                      pGVar3 = (context->scene->geometries).items[uVar63].ptr;
                      if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) goto LAB_01cb3b13;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar54 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_01cb3b3d;
                      fVar252 = fVar252 * 1.5 + local_9e0._0_4_ * -0.5 * fVar252 * fVar252 * fVar252
                      ;
                      auVar198._0_4_ = auVar69._0_4_ * fVar252;
                      auVar198._4_4_ = auVar69._4_4_ * fVar252;
                      auVar198._8_4_ = auVar69._8_4_ * fVar252;
                      auVar198._12_4_ = auVar69._12_4_ * fVar252;
                      auVar70 = vfmadd213ps_fma(auVar76,auVar198,auVar1);
                      auVar77 = vshufps_avx(auVar198,auVar198,0xc9);
                      auVar69 = vshufps_avx(auVar1,auVar1,0xc9);
                      auVar199._0_4_ = auVar198._0_4_ * auVar69._0_4_;
                      auVar199._4_4_ = auVar198._4_4_ * auVar69._4_4_;
                      auVar199._8_4_ = auVar198._8_4_ * auVar69._8_4_;
                      auVar199._12_4_ = auVar198._12_4_ * auVar69._12_4_;
                      auVar72 = vfmsub231ps_fma(auVar199,auVar1,auVar77);
                      auVar77 = vshufps_avx(auVar72,auVar72,0xc9);
                      auVar69 = vshufps_avx(auVar70,auVar70,0xc9);
                      auVar72 = vshufps_avx(auVar72,auVar72,0xd2);
                      auVar153._0_4_ = auVar70._0_4_ * auVar72._0_4_;
                      auVar153._4_4_ = auVar70._4_4_ * auVar72._4_4_;
                      auVar153._8_4_ = auVar70._8_4_ * auVar72._8_4_;
                      auVar153._12_4_ = auVar70._12_4_ * auVar72._12_4_;
                      auVar77 = vfmsub231ps_fma(auVar153,auVar77,auVar69);
                      auVar245 = vbroadcastss_avx512f(ZEXT416(1));
                      local_340 = vpermps_avx512f(auVar245,auVar254);
                      auVar245 = vpermps_avx512f(auVar245,ZEXT1664(auVar77));
                      auVar139 = vbroadcastss_avx512f(ZEXT416(2));
                      local_3c0 = vpermps_avx512f(auVar139,ZEXT1664(auVar77));
                      local_380 = vbroadcastss_avx512f(auVar77);
                      local_400[0] = (RTCHitN)auVar245[0];
                      local_400[1] = (RTCHitN)auVar245[1];
                      local_400[2] = (RTCHitN)auVar245[2];
                      local_400[3] = (RTCHitN)auVar245[3];
                      local_400[4] = (RTCHitN)auVar245[4];
                      local_400[5] = (RTCHitN)auVar245[5];
                      local_400[6] = (RTCHitN)auVar245[6];
                      local_400[7] = (RTCHitN)auVar245[7];
                      local_400[8] = (RTCHitN)auVar245[8];
                      local_400[9] = (RTCHitN)auVar245[9];
                      local_400[10] = (RTCHitN)auVar245[10];
                      local_400[0xb] = (RTCHitN)auVar245[0xb];
                      local_400[0xc] = (RTCHitN)auVar245[0xc];
                      local_400[0xd] = (RTCHitN)auVar245[0xd];
                      local_400[0xe] = (RTCHitN)auVar245[0xe];
                      local_400[0xf] = (RTCHitN)auVar245[0xf];
                      local_400[0x10] = (RTCHitN)auVar245[0x10];
                      local_400[0x11] = (RTCHitN)auVar245[0x11];
                      local_400[0x12] = (RTCHitN)auVar245[0x12];
                      local_400[0x13] = (RTCHitN)auVar245[0x13];
                      local_400[0x14] = (RTCHitN)auVar245[0x14];
                      local_400[0x15] = (RTCHitN)auVar245[0x15];
                      local_400[0x16] = (RTCHitN)auVar245[0x16];
                      local_400[0x17] = (RTCHitN)auVar245[0x17];
                      local_400[0x18] = (RTCHitN)auVar245[0x18];
                      local_400[0x19] = (RTCHitN)auVar245[0x19];
                      local_400[0x1a] = (RTCHitN)auVar245[0x1a];
                      local_400[0x1b] = (RTCHitN)auVar245[0x1b];
                      local_400[0x1c] = (RTCHitN)auVar245[0x1c];
                      local_400[0x1d] = (RTCHitN)auVar245[0x1d];
                      local_400[0x1e] = (RTCHitN)auVar245[0x1e];
                      local_400[0x1f] = (RTCHitN)auVar245[0x1f];
                      local_400[0x20] = (RTCHitN)auVar245[0x20];
                      local_400[0x21] = (RTCHitN)auVar245[0x21];
                      local_400[0x22] = (RTCHitN)auVar245[0x22];
                      local_400[0x23] = (RTCHitN)auVar245[0x23];
                      local_400[0x24] = (RTCHitN)auVar245[0x24];
                      local_400[0x25] = (RTCHitN)auVar245[0x25];
                      local_400[0x26] = (RTCHitN)auVar245[0x26];
                      local_400[0x27] = (RTCHitN)auVar245[0x27];
                      local_400[0x28] = (RTCHitN)auVar245[0x28];
                      local_400[0x29] = (RTCHitN)auVar245[0x29];
                      local_400[0x2a] = (RTCHitN)auVar245[0x2a];
                      local_400[0x2b] = (RTCHitN)auVar245[0x2b];
                      local_400[0x2c] = (RTCHitN)auVar245[0x2c];
                      local_400[0x2d] = (RTCHitN)auVar245[0x2d];
                      local_400[0x2e] = (RTCHitN)auVar245[0x2e];
                      local_400[0x2f] = (RTCHitN)auVar245[0x2f];
                      local_400[0x30] = (RTCHitN)auVar245[0x30];
                      local_400[0x31] = (RTCHitN)auVar245[0x31];
                      local_400[0x32] = (RTCHitN)auVar245[0x32];
                      local_400[0x33] = (RTCHitN)auVar245[0x33];
                      local_400[0x34] = (RTCHitN)auVar245[0x34];
                      local_400[0x35] = (RTCHitN)auVar245[0x35];
                      local_400[0x36] = (RTCHitN)auVar245[0x36];
                      local_400[0x37] = (RTCHitN)auVar245[0x37];
                      local_400[0x38] = (RTCHitN)auVar245[0x38];
                      local_400[0x39] = (RTCHitN)auVar245[0x39];
                      local_400[0x3a] = (RTCHitN)auVar245[0x3a];
                      local_400[0x3b] = (RTCHitN)auVar245[0x3b];
                      local_400[0x3c] = (RTCHitN)auVar245[0x3c];
                      local_400[0x3d] = (RTCHitN)auVar245[0x3d];
                      local_400[0x3e] = (RTCHitN)auVar245[0x3e];
                      local_400[0x3f] = (RTCHitN)auVar245[0x3f];
                      local_300 = 0;
                      uStack_2f8 = 0;
                      uStack_2f0 = 0;
                      uStack_2e8 = 0;
                      uStack_2e0 = 0;
                      uStack_2d8 = 0;
                      uStack_2d0 = 0;
                      uStack_2c8 = 0;
                      local_2c0 = local_480._0_8_;
                      uStack_2b8 = local_480._8_8_;
                      uStack_2b0 = local_480._16_8_;
                      uStack_2a8 = local_480._24_8_;
                      uStack_2a0 = local_480._32_8_;
                      uStack_298 = local_480._40_8_;
                      uStack_290 = local_480._48_8_;
                      uStack_288 = local_480._56_8_;
                      auVar245 = vmovdqa64_avx512f(local_4c0);
                      local_280 = vmovdqa64_avx512f(auVar245);
                      vpcmpeqd_avx2(auVar245._0_32_,auVar245._0_32_);
                      local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                      local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                      *(float *)(ray + k * 4 + 0x200) = fVar250;
                      auVar245 = vmovdqa64_avx512f(local_500);
                      local_780 = vmovdqa64_avx512f(auVar245);
                      local_a30.valid = (int *)local_780;
                      local_a30.geometryUserPtr = pGVar3->userPtr;
                      local_a30.context = context->user;
                      local_a30.hit = local_400;
                      local_a30.N = 0x10;
                      local_a30.ray = (RTCRayN *)ray;
                      if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar249 = ZEXT1664(auVar247);
                        auVar254 = ZEXT1664(auVar71);
                        auVar257 = ZEXT1664(local_9e0._0_16_);
                        auVar261 = ZEXT1664(auVar1);
                        (*pGVar3->occlusionFilterN)(&local_a30);
                        auVar164 = ZEXT3264(CONCAT428(0x3f800000,
                                                      CONCAT424(0x3f800000,
                                                                CONCAT420(0x3f800000,
                                                                          CONCAT416(0x3f800000,
                                                                                    CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                        auVar245 = vmovdqa64_avx512f(local_780);
                      }
                      uVar15 = vptestmd_avx512f(auVar245,auVar245);
                      if ((short)uVar15 != 0) {
                        p_Var4 = context->args->filter;
                        if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar249 = ZEXT1664(auVar249._0_16_);
                          auVar254 = ZEXT1664(auVar254._0_16_);
                          auVar257 = ZEXT1664(auVar257._0_16_);
                          auVar261 = ZEXT1664(auVar261._0_16_);
                          (*p_Var4)(&local_a30);
                          auVar164 = ZEXT3264(CONCAT428(0x3f800000,
                                                        CONCAT424(0x3f800000,
                                                                  CONCAT420(0x3f800000,
                                                                            CONCAT416(0x3f800000,
                                                                                      CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                          auVar245 = vmovdqa64_avx512f(local_780);
                        }
                        uVar66 = vptestmd_avx512f(auVar245,auVar245);
                        auVar245 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                        bVar5 = (bool)((byte)uVar66 & 1);
                        auVar138._0_4_ =
                             (uint)bVar5 * auVar245._0_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x200);
                        bVar5 = (bool)((byte)(uVar66 >> 1) & 1);
                        auVar138._4_4_ =
                             (uint)bVar5 * auVar245._4_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x204);
                        bVar5 = (bool)((byte)(uVar66 >> 2) & 1);
                        auVar138._8_4_ =
                             (uint)bVar5 * auVar245._8_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x208);
                        bVar5 = (bool)((byte)(uVar66 >> 3) & 1);
                        auVar138._12_4_ =
                             (uint)bVar5 * auVar245._12_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x20c);
                        bVar5 = (bool)((byte)(uVar66 >> 4) & 1);
                        auVar138._16_4_ =
                             (uint)bVar5 * auVar245._16_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x210);
                        bVar5 = (bool)((byte)(uVar66 >> 5) & 1);
                        auVar138._20_4_ =
                             (uint)bVar5 * auVar245._20_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x214);
                        bVar5 = (bool)((byte)(uVar66 >> 6) & 1);
                        auVar138._24_4_ =
                             (uint)bVar5 * auVar245._24_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x218);
                        bVar5 = (bool)((byte)(uVar66 >> 7) & 1);
                        auVar138._28_4_ =
                             (uint)bVar5 * auVar245._28_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x21c);
                        bVar5 = (bool)((byte)(uVar66 >> 8) & 1);
                        auVar138._32_4_ =
                             (uint)bVar5 * auVar245._32_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x220);
                        bVar5 = (bool)((byte)(uVar66 >> 9) & 1);
                        auVar138._36_4_ =
                             (uint)bVar5 * auVar245._36_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x224);
                        bVar5 = (bool)((byte)(uVar66 >> 10) & 1);
                        auVar138._40_4_ =
                             (uint)bVar5 * auVar245._40_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x228);
                        bVar5 = (bool)((byte)(uVar66 >> 0xb) & 1);
                        auVar138._44_4_ =
                             (uint)bVar5 * auVar245._44_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x22c);
                        bVar5 = (bool)((byte)(uVar66 >> 0xc) & 1);
                        auVar138._48_4_ =
                             (uint)bVar5 * auVar245._48_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x230);
                        bVar5 = (bool)((byte)(uVar66 >> 0xd) & 1);
                        auVar138._52_4_ =
                             (uint)bVar5 * auVar245._52_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x234);
                        bVar5 = (bool)((byte)(uVar66 >> 0xe) & 1);
                        auVar138._56_4_ =
                             (uint)bVar5 * auVar245._56_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x238);
                        bVar5 = SUB81(uVar66 >> 0xf,0);
                        auVar138._60_4_ =
                             (uint)bVar5 * auVar245._60_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x23c);
                        *(undefined1 (*) [64])(local_a30.ray + 0x200) = auVar138;
                        bVar54 = 1;
                        if ((short)uVar66 != 0) goto LAB_01cb3b3d;
                      }
                      *(float *)(ray + k * 4 + 0x200) = fVar251;
                    }
                    bVar54 = 0;
                    goto LAB_01cb3b3d;
                  }
                }
                bVar65 = uVar66 < 4;
                uVar66 = uVar66 + 1;
              } while (uVar66 != 5);
              bVar65 = false;
              auVar164 = ZEXT3264(CONCAT428(0x3f800000,
                                            CONCAT424(0x3f800000,
                                                      CONCAT420(0x3f800000,
                                                                CONCAT416(0x3f800000,
                                                                          CONCAT412(0x3f800000,
                                                                                    CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
              bVar54 = 5;
LAB_01cb3b3d:
              bVar64 = (bool)(bVar64 | bVar65 & bVar54);
              uVar172 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar162._4_4_ = uVar172;
              auVar162._0_4_ = uVar172;
              auVar162._8_4_ = uVar172;
              auVar162._12_4_ = uVar172;
              auVar162._16_4_ = uVar172;
              auVar162._20_4_ = uVar172;
              auVar162._24_4_ = uVar172;
              auVar162._28_4_ = uVar172;
              auVar48._4_4_ = fStack_6fc;
              auVar48._0_4_ = local_700;
              auVar48._8_4_ = fStack_6f8;
              auVar48._12_4_ = fStack_6f4;
              auVar48._16_4_ = fStack_6f0;
              auVar48._20_4_ = fStack_6ec;
              auVar48._24_4_ = fStack_6e8;
              auVar48._28_4_ = fStack_6e4;
              uVar15 = vcmpps_avx512vl(auVar162,auVar48,0xd);
              bVar60 = ~('\x01' << ((byte)iVar18 & 0x1f)) & bVar60 & (byte)uVar15;
              auVar80 = local_660;
            } while (bVar60 != 0);
          }
          auVar245 = ZEXT3264(local_6a0);
          bVar57 = local_720[0] | ~bVar57;
          auVar186._0_4_ = fVar165 + auVar80._0_4_;
          auVar186._4_4_ = fVar165 + auVar80._4_4_;
          auVar186._8_4_ = fVar165 + auVar80._8_4_;
          auVar186._12_4_ = fVar165 + auVar80._12_4_;
          auVar186._16_4_ = fVar165 + auVar80._16_4_;
          auVar186._20_4_ = fVar165 + auVar80._20_4_;
          auVar186._24_4_ = fVar165 + auVar80._24_4_;
          auVar186._28_4_ = fVar165 + auVar80._28_4_;
          uVar15 = vcmpps_avx512vl(auVar186,auVar162,2);
          bVar60 = (byte)uVar16 & bVar52 & (byte)uVar15;
          auVar187._8_4_ = 2;
          auVar187._0_8_ = 0x200000002;
          auVar187._12_4_ = 2;
          auVar187._16_4_ = 2;
          auVar187._20_4_ = 2;
          auVar187._24_4_ = 2;
          auVar187._28_4_ = 2;
          auVar29._8_4_ = 3;
          auVar29._0_8_ = 0x300000003;
          auVar29._12_4_ = 3;
          auVar29._16_4_ = 3;
          auVar29._20_4_ = 3;
          auVar29._24_4_ = 3;
          auVar29._28_4_ = 3;
          auVar80 = vpblendmd_avx512vl(auVar187,auVar29);
          auVar135._0_4_ = (uint)(bVar57 & 1) * auVar80._0_4_ | (uint)!(bool)(bVar57 & 1) * 2;
          bVar65 = (bool)(bVar57 >> 1 & 1);
          auVar135._4_4_ = (uint)bVar65 * auVar80._4_4_ | (uint)!bVar65 * 2;
          bVar65 = (bool)(bVar57 >> 2 & 1);
          auVar135._8_4_ = (uint)bVar65 * auVar80._8_4_ | (uint)!bVar65 * 2;
          bVar65 = (bool)(bVar57 >> 3 & 1);
          auVar135._12_4_ = (uint)bVar65 * auVar80._12_4_ | (uint)!bVar65 * 2;
          bVar65 = (bool)(bVar57 >> 4 & 1);
          auVar135._16_4_ = (uint)bVar65 * auVar80._16_4_ | (uint)!bVar65 * 2;
          bVar65 = (bool)(bVar57 >> 5 & 1);
          auVar135._20_4_ = (uint)bVar65 * auVar80._20_4_ | (uint)!bVar65 * 2;
          bVar65 = (bool)(bVar57 >> 6 & 1);
          auVar135._24_4_ = (uint)bVar65 * auVar80._24_4_ | (uint)!bVar65 * 2;
          auVar135._28_4_ = (uint)(bVar57 >> 7) * auVar80._28_4_ | (uint)!(bool)(bVar57 >> 7) * 2;
          uVar15 = vpcmpd_avx512vl(local_6c0,auVar135,5);
          bVar52 = (byte)uVar15 & bVar60;
          if (bVar52 != 0) {
            auVar77 = vminps_avx(local_940._0_16_,local_980._0_16_);
            auVar71 = vmaxps_avx(local_940._0_16_,local_980._0_16_);
            auVar69 = vminps_avx(local_960._0_16_,local_9a0._0_16_);
            auVar1 = vminps_avx(auVar77,auVar69);
            auVar77 = vmaxps_avx(local_960._0_16_,local_9a0._0_16_);
            auVar69 = vmaxps_avx(auVar71,auVar77);
            auVar200._8_4_ = 0x7fffffff;
            auVar200._0_8_ = 0x7fffffff7fffffff;
            auVar200._12_4_ = 0x7fffffff;
            auVar71 = vandps_avx(auVar1,auVar200);
            auVar77 = vandps_avx(auVar69,auVar200);
            auVar71 = vmaxps_avx(auVar71,auVar77);
            auVar77 = vmovshdup_avx(auVar71);
            auVar77 = vmaxss_avx(auVar77,auVar71);
            auVar71 = vshufpd_avx(auVar71,auVar71,1);
            auVar71 = vmaxss_avx(auVar71,auVar77);
            fVar246 = auVar71._0_4_ * 1.9073486e-06;
            local_910 = vshufps_avx(auVar69,auVar69,0xff);
            local_700 = fVar165 + local_6a0._0_4_;
            fStack_6fc = fVar165 + local_6a0._4_4_;
            fStack_6f8 = fVar165 + local_6a0._8_4_;
            fStack_6f4 = fVar165 + local_6a0._12_4_;
            fStack_6f0 = fVar165 + local_6a0._16_4_;
            fStack_6ec = fVar165 + local_6a0._20_4_;
            fStack_6e8 = fVar165 + local_6a0._24_4_;
            fStack_6e4 = fVar165 + local_6a0._28_4_;
            _local_a00 = local_6a0;
            local_720 = auVar135;
            do {
              auVar163._8_4_ = 0x7f800000;
              auVar163._0_8_ = 0x7f8000007f800000;
              auVar163._12_4_ = 0x7f800000;
              auVar163._16_4_ = 0x7f800000;
              auVar163._20_4_ = 0x7f800000;
              auVar163._24_4_ = 0x7f800000;
              auVar163._28_4_ = 0x7f800000;
              auVar80 = vblendmps_avx512vl(auVar163,auVar245._0_32_);
              auVar136._0_4_ =
                   (uint)(bVar52 & 1) * auVar80._0_4_ | (uint)!(bool)(bVar52 & 1) * 0x7f800000;
              bVar65 = (bool)(bVar52 >> 1 & 1);
              auVar136._4_4_ = (uint)bVar65 * auVar80._4_4_ | (uint)!bVar65 * 0x7f800000;
              bVar65 = (bool)(bVar52 >> 2 & 1);
              auVar136._8_4_ = (uint)bVar65 * auVar80._8_4_ | (uint)!bVar65 * 0x7f800000;
              bVar65 = (bool)(bVar52 >> 3 & 1);
              auVar136._12_4_ = (uint)bVar65 * auVar80._12_4_ | (uint)!bVar65 * 0x7f800000;
              bVar65 = (bool)(bVar52 >> 4 & 1);
              auVar136._16_4_ = (uint)bVar65 * auVar80._16_4_ | (uint)!bVar65 * 0x7f800000;
              bVar65 = (bool)(bVar52 >> 5 & 1);
              auVar136._20_4_ = (uint)bVar65 * auVar80._20_4_ | (uint)!bVar65 * 0x7f800000;
              auVar136._24_4_ =
                   (uint)(bVar52 >> 6) * auVar80._24_4_ | (uint)!(bool)(bVar52 >> 6) * 0x7f800000;
              auVar136._28_4_ = 0x7f800000;
              auVar80 = vshufps_avx(auVar136,auVar136,0xb1);
              auVar80 = vminps_avx(auVar136,auVar80);
              auVar81 = vshufpd_avx(auVar80,auVar80,5);
              auVar80 = vminps_avx(auVar80,auVar81);
              auVar81 = vpermpd_avx2(auVar80,0x4e);
              auVar80 = vminps_avx(auVar80,auVar81);
              uVar15 = vcmpps_avx512vl(auVar136,auVar80,0);
              bVar54 = (byte)uVar15 & bVar52;
              bVar57 = bVar52;
              if (bVar54 != 0) {
                bVar57 = bVar54;
              }
              iVar18 = 0;
              for (uVar68 = (uint)bVar57; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000) {
                iVar18 = iVar18 + 1;
              }
              uVar68 = *(uint *)(local_540 + (uint)(iVar18 << 2));
              uVar67 = *(uint *)(local_680 + (uint)(iVar18 << 2));
              fVar250 = auVar12._0_4_;
              if ((float)local_9c0._0_4_ < 0.0) {
                fVar250 = sqrtf((float)local_9c0._0_4_);
              }
              auVar71 = vinsertps_avx(ZEXT416(uVar67),ZEXT416(uVar68),0x10);
              auVar254 = ZEXT1664(auVar71);
              bVar65 = true;
              uVar66 = 0;
              do {
                uVar172 = auVar254._0_4_;
                auVar154._4_4_ = uVar172;
                auVar154._0_4_ = uVar172;
                auVar154._8_4_ = uVar172;
                auVar154._12_4_ = uVar172;
                auVar71 = vfmadd132ps_fma(auVar154,ZEXT816(0) << 0x40,local_9b0);
                auVar77 = vmovshdup_avx(auVar254._0_16_);
                fVar237 = auVar77._0_4_;
                fVar262 = 1.0 - fVar237;
                fVar252 = fVar262 * fVar262 * fVar262;
                fVar217 = fVar237 * fVar237 * fVar237;
                auVar69 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar252),
                                          ZEXT416((uint)fVar217));
                fVar251 = fVar237 * fVar262;
                auVar231 = ZEXT416((uint)fVar262);
                auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar251 * fVar237 * 6.0)),
                                          ZEXT416((uint)(fVar251 * fVar262)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar217),
                                         ZEXT416((uint)fVar252));
                auVar70 = vfmadd231ss_fma(ZEXT416((uint)(fVar251 * fVar262 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar251 * fVar237)));
                fVar252 = fVar252 * 0.16666667;
                fVar229 = (auVar69._0_4_ + auVar72._0_4_) * 0.16666667;
                fVar230 = (auVar1._0_4_ + auVar70._0_4_) * 0.16666667;
                fVar217 = fVar217 * 0.16666667;
                auVar201._0_4_ = fVar217 * (float)local_9a0._0_4_;
                auVar201._4_4_ = fVar217 * (float)local_9a0._4_4_;
                auVar201._8_4_ = fVar217 * fStack_998;
                auVar201._12_4_ = fVar217 * fStack_994;
                auVar233._4_4_ = fVar230;
                auVar233._0_4_ = fVar230;
                auVar233._8_4_ = fVar230;
                auVar233._12_4_ = fVar230;
                auVar69 = vfmadd132ps_fma(auVar233,auVar201,local_960._0_16_);
                auVar202._4_4_ = fVar229;
                auVar202._0_4_ = fVar229;
                auVar202._8_4_ = fVar229;
                auVar202._12_4_ = fVar229;
                auVar69 = vfmadd132ps_fma(auVar202,auVar69,local_980._0_16_);
                auVar179._4_4_ = fVar252;
                auVar179._0_4_ = fVar252;
                auVar179._8_4_ = fVar252;
                auVar179._12_4_ = fVar252;
                auVar69 = vfmadd132ps_fma(auVar179,auVar69,local_940._0_16_);
                local_840._0_16_ = auVar69;
                auVar69 = vsubps_avx(auVar71,auVar69);
                auVar71 = vdpps_avx(auVar69,auVar69,0x7f);
                local_9e0._0_16_ = auVar71;
                local_7c0 = auVar254;
                if (auVar71._0_4_ < 0.0) {
                  auVar249._0_4_ = sqrtf(auVar71._0_4_);
                  auVar249._4_60_ = extraout_var_00;
                  auVar71 = auVar249._0_16_;
                }
                else {
                  auVar71 = vsqrtss_avx(auVar71,auVar71);
                }
                local_860._4_4_ = fVar262;
                local_860._0_4_ = fVar262;
                fStack_858 = fVar262;
                fStack_854 = fVar262;
                auVar72 = vfnmsub213ss_fma(auVar77,auVar77,ZEXT416((uint)(fVar251 * 4.0)));
                auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar251 * 4.0)),auVar231,auVar231);
                fVar251 = fVar262 * -fVar262 * 0.5;
                fVar252 = auVar72._0_4_ * 0.5;
                fVar229 = auVar1._0_4_ * 0.5;
                fVar230 = fVar237 * fVar237 * 0.5;
                auVar223._0_4_ = fVar230 * (float)local_9a0._0_4_;
                auVar223._4_4_ = fVar230 * (float)local_9a0._4_4_;
                auVar223._8_4_ = fVar230 * fStack_998;
                auVar223._12_4_ = fVar230 * fStack_994;
                auVar180._4_4_ = fVar229;
                auVar180._0_4_ = fVar229;
                auVar180._8_4_ = fVar229;
                auVar180._12_4_ = fVar229;
                auVar1 = vfmadd132ps_fma(auVar180,auVar223,local_960._0_16_);
                auVar203._4_4_ = fVar252;
                auVar203._0_4_ = fVar252;
                auVar203._8_4_ = fVar252;
                auVar203._12_4_ = fVar252;
                auVar1 = vfmadd132ps_fma(auVar203,auVar1,local_980._0_16_);
                auVar259._4_4_ = fVar251;
                auVar259._0_4_ = fVar251;
                auVar259._8_4_ = fVar251;
                auVar259._12_4_ = fVar251;
                auVar1 = vfmadd132ps_fma(auVar259,auVar1,local_940._0_16_);
                local_880._0_16_ = vdpps_avx(auVar1,auVar1,0x7f);
                auVar47._12_4_ = 0;
                auVar47._0_12_ = ZEXT812(0);
                fVar251 = local_880._0_4_;
                auVar72 = vrsqrt14ss_avx512f(auVar47 << 0x20,ZEXT416((uint)fVar251));
                fVar252 = auVar72._0_4_;
                local_8a0._0_16_ = vrcp14ss_avx512f(auVar47 << 0x20,ZEXT416((uint)fVar251));
                auVar72 = vfnmadd213ss_fma(local_8a0._0_16_,local_880._0_16_,ZEXT416(0x40000000));
                uVar68 = auVar71._0_4_;
                if (fVar251 < -fVar251) {
                  fVar229 = sqrtf(fVar251);
                  auVar71 = ZEXT416(uVar68);
                }
                else {
                  auVar70 = vsqrtss_avx(local_880._0_16_,local_880._0_16_);
                  fVar229 = auVar70._0_4_;
                }
                auVar75 = vbroadcastss_avx512vl
                                    (ZEXT416((uint)(fVar252 * 1.5 +
                                                   fVar251 * -0.5 * fVar252 * fVar252 * fVar252)));
                auVar74 = vmulps_avx512vl(auVar1,auVar75);
                auVar70 = vdpps_avx(auVar69,auVar74,0x7f);
                fVar230 = auVar71._0_4_;
                fVar251 = auVar70._0_4_;
                auVar155._0_4_ = fVar251 * fVar251;
                auVar155._4_4_ = auVar70._4_4_ * auVar70._4_4_;
                auVar155._8_4_ = auVar70._8_4_ * auVar70._8_4_;
                auVar155._12_4_ = auVar70._12_4_ * auVar70._12_4_;
                auVar76 = vsubps_avx(local_9e0._0_16_,auVar155);
                fVar252 = auVar76._0_4_;
                auVar181._4_12_ = ZEXT812(0) << 0x20;
                auVar181._0_4_ = fVar252;
                auVar73 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar181);
                auVar78 = vmulss_avx512f(auVar73,ZEXT416(0x3fc00000));
                auVar79 = vmulss_avx512f(auVar76,ZEXT416(0xbf000000));
                if (fVar252 < 0.0) {
                  local_8e0._0_4_ = auVar78._0_4_;
                  _local_900 = auVar75;
                  local_8f0 = auVar74;
                  local_8d0 = auVar73;
                  fVar252 = sqrtf(fVar252);
                  auVar79 = ZEXT416(auVar79._0_4_);
                  auVar78 = ZEXT416((uint)local_8e0._0_4_);
                  auVar71 = ZEXT416(uVar68);
                  auVar73 = local_8d0;
                  auVar74 = local_8f0;
                  auVar75 = _local_900;
                }
                else {
                  auVar76 = vsqrtss_avx(auVar76,auVar76);
                  fVar252 = auVar76._0_4_;
                }
                auVar261 = ZEXT1664(auVar1);
                auVar257 = ZEXT1664(local_9e0._0_16_);
                auVar76 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar231,auVar77);
                auVar231 = vfmadd213ss_fma(auVar77,SUB6416(ZEXT464(0xc0000000),0),auVar231);
                auVar253 = local_7c0._0_16_;
                auVar77 = vshufps_avx(auVar253,auVar253,0x55);
                auVar204._0_4_ = auVar77._0_4_ * (float)local_9a0._0_4_;
                auVar204._4_4_ = auVar77._4_4_ * (float)local_9a0._4_4_;
                auVar204._8_4_ = auVar77._8_4_ * fStack_998;
                auVar204._12_4_ = auVar77._12_4_ * fStack_994;
                auVar224._0_4_ = auVar231._0_4_;
                auVar224._4_4_ = auVar224._0_4_;
                auVar224._8_4_ = auVar224._0_4_;
                auVar224._12_4_ = auVar224._0_4_;
                auVar77 = vfmadd132ps_fma(auVar224,auVar204,local_960._0_16_);
                auVar182._0_4_ = auVar76._0_4_;
                auVar182._4_4_ = auVar182._0_4_;
                auVar182._8_4_ = auVar182._0_4_;
                auVar182._12_4_ = auVar182._0_4_;
                auVar77 = vfmadd132ps_fma(auVar182,auVar77,local_980._0_16_);
                auVar77 = vfmadd132ps_fma(_local_860,auVar77,local_940._0_16_);
                auVar183._0_4_ = auVar77._0_4_ * (float)local_880._0_4_;
                auVar183._4_4_ = auVar77._4_4_ * (float)local_880._0_4_;
                auVar183._8_4_ = auVar77._8_4_ * (float)local_880._0_4_;
                auVar183._12_4_ = auVar77._12_4_ * (float)local_880._0_4_;
                auVar77 = vdpps_avx(auVar1,auVar77,0x7f);
                fVar217 = auVar77._0_4_;
                auVar205._0_4_ = auVar1._0_4_ * fVar217;
                auVar205._4_4_ = auVar1._4_4_ * fVar217;
                auVar205._8_4_ = auVar1._8_4_ * fVar217;
                auVar205._12_4_ = auVar1._12_4_ * fVar217;
                auVar77 = vsubps_avx(auVar183,auVar205);
                fVar217 = auVar72._0_4_ * (float)local_8a0._0_4_;
                auVar231 = vmaxss_avx(ZEXT416((uint)fVar246),
                                      ZEXT416((uint)(local_7c0._0_4_ * fVar250 * 1.9073486e-06)));
                auVar206._0_4_ = auVar77._0_4_ * fVar217;
                auVar206._4_4_ = auVar77._4_4_ * fVar217;
                auVar206._8_4_ = auVar77._8_4_ * fVar217;
                auVar206._12_4_ = auVar77._12_4_ * fVar217;
                auVar22._8_4_ = 0x80000000;
                auVar22._0_8_ = 0x8000000080000000;
                auVar22._12_4_ = 0x80000000;
                auVar76 = vxorps_avx512vl(auVar1,auVar22);
                auVar75 = vmulps_avx512vl(auVar75,auVar206);
                auVar77 = vdpps_avx(auVar76,auVar74,0x7f);
                auVar72 = vfmadd213ss_fma(auVar71,ZEXT416((uint)fVar246),auVar231);
                auVar71 = vdpps_avx(auVar69,auVar75,0x7f);
                auVar75 = vfmadd213ss_fma(ZEXT416((uint)(fVar230 + 1.0)),
                                          ZEXT416((uint)(fVar246 / fVar229)),auVar72);
                fVar229 = auVar77._0_4_ + auVar71._0_4_;
                auVar71 = vdpps_avx(local_9b0,auVar74,0x7f);
                auVar77 = vdpps_avx(auVar69,auVar76,0x7f);
                auVar72 = vmulss_avx512f(auVar79,auVar73);
                auVar74 = vaddss_avx512f(auVar78,ZEXT416((uint)(auVar72._0_4_ *
                                                               auVar73._0_4_ * auVar73._0_4_)));
                auVar72 = vdpps_avx(auVar69,local_9b0,0x7f);
                auVar73 = vfnmadd231ss_fma(auVar77,auVar70,ZEXT416((uint)fVar229));
                auVar72 = vfnmadd231ss_fma(auVar72,auVar70,auVar71);
                auVar77 = vpermilps_avx(local_840._0_16_,0xff);
                fVar252 = fVar252 - auVar77._0_4_;
                auVar76 = vshufps_avx(auVar1,auVar1,0xff);
                auVar77 = vfmsub213ss_fma(auVar73,auVar74,auVar76);
                auVar249 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
                auVar243._0_8_ = auVar77._0_8_ ^ 0x8000000080000000;
                auVar243._8_4_ = auVar77._8_4_ ^ 0x80000000;
                auVar243._12_4_ = auVar77._12_4_ ^ 0x80000000;
                auVar72 = ZEXT416((uint)(auVar72._0_4_ * auVar74._0_4_));
                auVar73 = vfmsub231ss_fma(ZEXT416((uint)(auVar71._0_4_ * auVar77._0_4_)),
                                          ZEXT416((uint)fVar229),auVar72);
                auVar77 = vinsertps_avx(auVar243,auVar72,0x1c);
                auVar239._0_8_ = auVar71._0_8_ ^ 0x8000000080000000;
                auVar239._8_4_ = auVar71._8_4_ ^ 0x80000000;
                auVar239._12_4_ = auVar71._12_4_ ^ 0x80000000;
                auVar72 = vinsertps_avx(ZEXT416((uint)fVar229),auVar239,0x10);
                auVar225._0_4_ = auVar73._0_4_;
                auVar225._4_4_ = auVar225._0_4_;
                auVar225._8_4_ = auVar225._0_4_;
                auVar225._12_4_ = auVar225._0_4_;
                auVar71 = vdivps_avx(auVar77,auVar225);
                auVar77 = vdivps_avx(auVar72,auVar225);
                auVar226._0_4_ = fVar251 * auVar71._0_4_ + fVar252 * auVar77._0_4_;
                auVar226._4_4_ = fVar251 * auVar71._4_4_ + fVar252 * auVar77._4_4_;
                auVar226._8_4_ = fVar251 * auVar71._8_4_ + fVar252 * auVar77._8_4_;
                auVar226._12_4_ = fVar251 * auVar71._12_4_ + fVar252 * auVar77._12_4_;
                auVar71 = vsubps_avx(auVar253,auVar226);
                auVar254 = ZEXT1664(auVar71);
                auVar23._8_4_ = 0x7fffffff;
                auVar23._0_8_ = 0x7fffffff7fffffff;
                auVar23._12_4_ = 0x7fffffff;
                auVar77 = vandps_avx512vl(auVar70,auVar23);
                if (auVar77._0_4_ < auVar75._0_4_) {
                  auVar77 = vfmadd231ss_fma(ZEXT416((uint)(auVar75._0_4_ + auVar231._0_4_)),
                                            local_910,ZEXT416(0x36000000));
                  auVar24._8_4_ = 0x7fffffff;
                  auVar24._0_8_ = 0x7fffffff7fffffff;
                  auVar24._12_4_ = 0x7fffffff;
                  auVar72 = vandps_avx512vl(ZEXT416((uint)fVar252),auVar24);
                  if (auVar72._0_4_ < auVar77._0_4_) {
                    fVar250 = auVar71._0_4_ + (float)local_920._0_4_;
                    auVar164 = ZEXT3264(CONCAT428(0x3f800000,
                                                  CONCAT424(0x3f800000,
                                                            CONCAT420(0x3f800000,
                                                                      CONCAT416(0x3f800000,
                                                                                CONCAT412(0x3f800000
                                                                                          ,CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                    if (fVar250 < fVar148) {
                      bVar57 = 0;
                      goto LAB_01cb47d2;
                    }
                    fVar251 = *(float *)(ray + k * 4 + 0x200);
                    auVar249 = ZEXT464((uint)fVar251);
                    auVar245 = ZEXT3264(_local_a00);
                    if (fVar250 <= fVar251) {
                      auVar77 = vmovshdup_avx(auVar71);
                      bVar57 = 0;
                      if ((auVar77._0_4_ < 0.0) || (1.0 < auVar77._0_4_)) goto LAB_01cb47db;
                      auVar227._0_12_ = ZEXT812(0);
                      auVar227._12_4_ = 0;
                      auVar207._4_8_ = auVar227._4_8_;
                      auVar207._0_4_ = local_9e0._0_4_;
                      auVar207._12_4_ = 0;
                      auVar77 = vrsqrt14ss_avx512f(auVar227,auVar207);
                      fVar252 = auVar77._0_4_;
                      pGVar3 = (context->scene->geometries).items[uVar63].ptr;
                      if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
                        bVar57 = 0;
                        goto LAB_01cb47db;
                      }
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar57 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_01cb47db;
                      fVar252 = fVar252 * 1.5 + local_9e0._0_4_ * -0.5 * fVar252 * fVar252 * fVar252
                      ;
                      auVar208._0_4_ = auVar69._0_4_ * fVar252;
                      auVar208._4_4_ = auVar69._4_4_ * fVar252;
                      auVar208._8_4_ = auVar69._8_4_ * fVar252;
                      auVar208._12_4_ = auVar69._12_4_ * fVar252;
                      auVar70 = vfmadd213ps_fma(auVar76,auVar208,auVar1);
                      auVar77 = vshufps_avx(auVar208,auVar208,0xc9);
                      auVar69 = vshufps_avx(auVar1,auVar1,0xc9);
                      auVar209._0_4_ = auVar208._0_4_ * auVar69._0_4_;
                      auVar209._4_4_ = auVar208._4_4_ * auVar69._4_4_;
                      auVar209._8_4_ = auVar208._8_4_ * auVar69._8_4_;
                      auVar209._12_4_ = auVar208._12_4_ * auVar69._12_4_;
                      auVar72 = vfmsub231ps_fma(auVar209,auVar1,auVar77);
                      auVar77 = vshufps_avx(auVar72,auVar72,0xc9);
                      auVar69 = vshufps_avx(auVar70,auVar70,0xc9);
                      auVar72 = vshufps_avx(auVar72,auVar72,0xd2);
                      auVar156._0_4_ = auVar70._0_4_ * auVar72._0_4_;
                      auVar156._4_4_ = auVar70._4_4_ * auVar72._4_4_;
                      auVar156._8_4_ = auVar70._8_4_ * auVar72._8_4_;
                      auVar156._12_4_ = auVar70._12_4_ * auVar72._12_4_;
                      auVar77 = vfmsub231ps_fma(auVar156,auVar77,auVar69);
                      auVar249 = vbroadcastss_avx512f(ZEXT416(1));
                      local_340 = vpermps_avx512f(auVar249,auVar254);
                      auVar249 = vpermps_avx512f(auVar249,ZEXT1664(auVar77));
                      auVar139 = vbroadcastss_avx512f(ZEXT416(2));
                      local_3c0 = vpermps_avx512f(auVar139,ZEXT1664(auVar77));
                      local_380 = vbroadcastss_avx512f(auVar77);
                      local_400[0] = (RTCHitN)auVar249[0];
                      local_400[1] = (RTCHitN)auVar249[1];
                      local_400[2] = (RTCHitN)auVar249[2];
                      local_400[3] = (RTCHitN)auVar249[3];
                      local_400[4] = (RTCHitN)auVar249[4];
                      local_400[5] = (RTCHitN)auVar249[5];
                      local_400[6] = (RTCHitN)auVar249[6];
                      local_400[7] = (RTCHitN)auVar249[7];
                      local_400[8] = (RTCHitN)auVar249[8];
                      local_400[9] = (RTCHitN)auVar249[9];
                      local_400[10] = (RTCHitN)auVar249[10];
                      local_400[0xb] = (RTCHitN)auVar249[0xb];
                      local_400[0xc] = (RTCHitN)auVar249[0xc];
                      local_400[0xd] = (RTCHitN)auVar249[0xd];
                      local_400[0xe] = (RTCHitN)auVar249[0xe];
                      local_400[0xf] = (RTCHitN)auVar249[0xf];
                      local_400[0x10] = (RTCHitN)auVar249[0x10];
                      local_400[0x11] = (RTCHitN)auVar249[0x11];
                      local_400[0x12] = (RTCHitN)auVar249[0x12];
                      local_400[0x13] = (RTCHitN)auVar249[0x13];
                      local_400[0x14] = (RTCHitN)auVar249[0x14];
                      local_400[0x15] = (RTCHitN)auVar249[0x15];
                      local_400[0x16] = (RTCHitN)auVar249[0x16];
                      local_400[0x17] = (RTCHitN)auVar249[0x17];
                      local_400[0x18] = (RTCHitN)auVar249[0x18];
                      local_400[0x19] = (RTCHitN)auVar249[0x19];
                      local_400[0x1a] = (RTCHitN)auVar249[0x1a];
                      local_400[0x1b] = (RTCHitN)auVar249[0x1b];
                      local_400[0x1c] = (RTCHitN)auVar249[0x1c];
                      local_400[0x1d] = (RTCHitN)auVar249[0x1d];
                      local_400[0x1e] = (RTCHitN)auVar249[0x1e];
                      local_400[0x1f] = (RTCHitN)auVar249[0x1f];
                      local_400[0x20] = (RTCHitN)auVar249[0x20];
                      local_400[0x21] = (RTCHitN)auVar249[0x21];
                      local_400[0x22] = (RTCHitN)auVar249[0x22];
                      local_400[0x23] = (RTCHitN)auVar249[0x23];
                      local_400[0x24] = (RTCHitN)auVar249[0x24];
                      local_400[0x25] = (RTCHitN)auVar249[0x25];
                      local_400[0x26] = (RTCHitN)auVar249[0x26];
                      local_400[0x27] = (RTCHitN)auVar249[0x27];
                      local_400[0x28] = (RTCHitN)auVar249[0x28];
                      local_400[0x29] = (RTCHitN)auVar249[0x29];
                      local_400[0x2a] = (RTCHitN)auVar249[0x2a];
                      local_400[0x2b] = (RTCHitN)auVar249[0x2b];
                      local_400[0x2c] = (RTCHitN)auVar249[0x2c];
                      local_400[0x2d] = (RTCHitN)auVar249[0x2d];
                      local_400[0x2e] = (RTCHitN)auVar249[0x2e];
                      local_400[0x2f] = (RTCHitN)auVar249[0x2f];
                      local_400[0x30] = (RTCHitN)auVar249[0x30];
                      local_400[0x31] = (RTCHitN)auVar249[0x31];
                      local_400[0x32] = (RTCHitN)auVar249[0x32];
                      local_400[0x33] = (RTCHitN)auVar249[0x33];
                      local_400[0x34] = (RTCHitN)auVar249[0x34];
                      local_400[0x35] = (RTCHitN)auVar249[0x35];
                      local_400[0x36] = (RTCHitN)auVar249[0x36];
                      local_400[0x37] = (RTCHitN)auVar249[0x37];
                      local_400[0x38] = (RTCHitN)auVar249[0x38];
                      local_400[0x39] = (RTCHitN)auVar249[0x39];
                      local_400[0x3a] = (RTCHitN)auVar249[0x3a];
                      local_400[0x3b] = (RTCHitN)auVar249[0x3b];
                      local_400[0x3c] = (RTCHitN)auVar249[0x3c];
                      local_400[0x3d] = (RTCHitN)auVar249[0x3d];
                      local_400[0x3e] = (RTCHitN)auVar249[0x3e];
                      local_400[0x3f] = (RTCHitN)auVar249[0x3f];
                      local_300 = 0;
                      uStack_2f8 = 0;
                      uStack_2f0 = 0;
                      uStack_2e8 = 0;
                      uStack_2e0 = 0;
                      uStack_2d8 = 0;
                      uStack_2d0 = 0;
                      uStack_2c8 = 0;
                      local_2c0 = local_480._0_8_;
                      uStack_2b8 = local_480._8_8_;
                      uStack_2b0 = local_480._16_8_;
                      uStack_2a8 = local_480._24_8_;
                      uStack_2a0 = local_480._32_8_;
                      uStack_298 = local_480._40_8_;
                      uStack_290 = local_480._48_8_;
                      uStack_288 = local_480._56_8_;
                      auVar249 = vmovdqa64_avx512f(local_4c0);
                      local_280 = vmovdqa64_avx512f(auVar249);
                      vpcmpeqd_avx2(auVar249._0_32_,auVar249._0_32_);
                      local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                      local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                      *(float *)(ray + k * 4 + 0x200) = fVar250;
                      auVar139 = vmovdqa64_avx512f(local_500);
                      local_780 = vmovdqa64_avx512f(auVar139);
                      local_a30.valid = (int *)local_780;
                      local_a30.geometryUserPtr = pGVar3->userPtr;
                      local_a30.context = context->user;
                      local_a30.hit = local_400;
                      local_a30.N = 0x10;
                      local_a30.ray = (RTCRayN *)ray;
                      if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar254 = ZEXT1664(auVar71);
                        auVar257 = ZEXT1664(local_9e0._0_16_);
                        auVar261 = ZEXT1664(auVar1);
                        (*pGVar3->occlusionFilterN)(&local_a30);
                        auVar245 = ZEXT3264(_local_a00);
                        auVar164 = ZEXT3264(CONCAT428(0x3f800000,
                                                      CONCAT424(0x3f800000,
                                                                CONCAT420(0x3f800000,
                                                                          CONCAT416(0x3f800000,
                                                                                    CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                        auVar139 = vmovdqa64_avx512f(local_780);
                      }
                      uVar15 = vptestmd_avx512f(auVar139,auVar139);
                      if ((short)uVar15 != 0) {
                        p_Var4 = context->args->filter;
                        if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar254 = ZEXT1664(auVar254._0_16_);
                          auVar257 = ZEXT1664(auVar257._0_16_);
                          auVar261 = ZEXT1664(auVar261._0_16_);
                          (*p_Var4)(&local_a30);
                          auVar245 = ZEXT3264(_local_a00);
                          auVar164 = ZEXT3264(CONCAT428(0x3f800000,
                                                        CONCAT424(0x3f800000,
                                                                  CONCAT420(0x3f800000,
                                                                            CONCAT416(0x3f800000,
                                                                                      CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                          auVar139 = vmovdqa64_avx512f(local_780);
                        }
                        auVar249 = ZEXT464((uint)fVar251);
                        uVar66 = vptestmd_avx512f(auVar139,auVar139);
                        auVar139 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                        bVar5 = (bool)((byte)uVar66 & 1);
                        auVar140._0_4_ =
                             (uint)bVar5 * auVar139._0_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x200);
                        bVar5 = (bool)((byte)(uVar66 >> 1) & 1);
                        auVar140._4_4_ =
                             (uint)bVar5 * auVar139._4_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x204);
                        bVar5 = (bool)((byte)(uVar66 >> 2) & 1);
                        auVar140._8_4_ =
                             (uint)bVar5 * auVar139._8_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x208);
                        bVar5 = (bool)((byte)(uVar66 >> 3) & 1);
                        auVar140._12_4_ =
                             (uint)bVar5 * auVar139._12_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x20c);
                        bVar5 = (bool)((byte)(uVar66 >> 4) & 1);
                        auVar140._16_4_ =
                             (uint)bVar5 * auVar139._16_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x210);
                        bVar5 = (bool)((byte)(uVar66 >> 5) & 1);
                        auVar140._20_4_ =
                             (uint)bVar5 * auVar139._20_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x214);
                        bVar5 = (bool)((byte)(uVar66 >> 6) & 1);
                        auVar140._24_4_ =
                             (uint)bVar5 * auVar139._24_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x218);
                        bVar5 = (bool)((byte)(uVar66 >> 7) & 1);
                        auVar140._28_4_ =
                             (uint)bVar5 * auVar139._28_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x21c);
                        bVar5 = (bool)((byte)(uVar66 >> 8) & 1);
                        auVar140._32_4_ =
                             (uint)bVar5 * auVar139._32_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x220);
                        bVar5 = (bool)((byte)(uVar66 >> 9) & 1);
                        auVar140._36_4_ =
                             (uint)bVar5 * auVar139._36_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x224);
                        bVar5 = (bool)((byte)(uVar66 >> 10) & 1);
                        auVar140._40_4_ =
                             (uint)bVar5 * auVar139._40_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x228);
                        bVar5 = (bool)((byte)(uVar66 >> 0xb) & 1);
                        auVar140._44_4_ =
                             (uint)bVar5 * auVar139._44_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x22c);
                        bVar5 = (bool)((byte)(uVar66 >> 0xc) & 1);
                        auVar140._48_4_ =
                             (uint)bVar5 * auVar139._48_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x230);
                        bVar5 = (bool)((byte)(uVar66 >> 0xd) & 1);
                        auVar140._52_4_ =
                             (uint)bVar5 * auVar139._52_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x234);
                        bVar5 = (bool)((byte)(uVar66 >> 0xe) & 1);
                        auVar140._56_4_ =
                             (uint)bVar5 * auVar139._56_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x238);
                        bVar5 = SUB81(uVar66 >> 0xf,0);
                        auVar140._60_4_ =
                             (uint)bVar5 * auVar139._60_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x23c);
                        *(undefined1 (*) [64])(local_a30.ray + 0x200) = auVar140;
                        bVar57 = 1;
                        if ((short)uVar66 != 0) goto LAB_01cb47db;
                      }
                      *(float *)(ray + k * 4 + 0x200) = fVar251;
                    }
                    auVar249 = ZEXT464((uint)fVar251);
                    bVar57 = 0;
                    goto LAB_01cb47db;
                  }
                }
                bVar65 = uVar66 < 4;
                uVar66 = uVar66 + 1;
              } while (uVar66 != 5);
              bVar65 = false;
              auVar164 = ZEXT3264(CONCAT428(0x3f800000,
                                            CONCAT424(0x3f800000,
                                                      CONCAT420(0x3f800000,
                                                                CONCAT416(0x3f800000,
                                                                          CONCAT412(0x3f800000,
                                                                                    CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
              bVar57 = 5;
LAB_01cb47d2:
              auVar245 = ZEXT3264(_local_a00);
LAB_01cb47db:
              bVar64 = (bool)(bVar64 | bVar65 & bVar57);
              uVar172 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar162._4_4_ = uVar172;
              auVar162._0_4_ = uVar172;
              auVar162._8_4_ = uVar172;
              auVar162._12_4_ = uVar172;
              auVar162._16_4_ = uVar172;
              auVar162._20_4_ = uVar172;
              auVar162._24_4_ = uVar172;
              auVar162._28_4_ = uVar172;
              auVar49._4_4_ = fStack_6fc;
              auVar49._0_4_ = local_700;
              auVar49._8_4_ = fStack_6f8;
              auVar49._12_4_ = fStack_6f4;
              auVar49._16_4_ = fStack_6f0;
              auVar49._20_4_ = fStack_6ec;
              auVar49._24_4_ = fStack_6e8;
              auVar49._28_4_ = fStack_6e4;
              uVar15 = vcmpps_avx512vl(auVar162,auVar49,0xd);
              bVar52 = ~('\x01' << ((byte)iVar18 & 0x1f)) & bVar52 & (byte)uVar15;
            } while (bVar52 != 0);
            auVar245 = ZEXT3264(local_6a0);
            auVar135 = local_720;
          }
          uVar16 = vpcmpgtd_avx512vl(auVar135,local_6c0);
          uVar17 = vpcmpd_avx512vl(local_6c0,local_640,1);
          auVar212._0_4_ = fVar165 + (float)local_440._0_4_;
          auVar212._4_4_ = fVar165 + (float)local_440._4_4_;
          auVar212._8_4_ = fVar165 + fStack_438;
          auVar212._12_4_ = fVar165 + fStack_434;
          auVar212._16_4_ = fVar165 + fStack_430;
          auVar212._20_4_ = fVar165 + fStack_42c;
          auVar212._24_4_ = fVar165 + fStack_428;
          auVar212._28_4_ = fVar165 + fStack_424;
          uVar15 = vcmpps_avx512vl(auVar212,auVar162,2);
          bVar58 = bVar58 & (byte)uVar17 & (byte)uVar15;
          auVar213._0_4_ = fVar165 + auVar245._0_4_;
          auVar213._4_4_ = fVar165 + auVar245._4_4_;
          auVar213._8_4_ = fVar165 + auVar245._8_4_;
          auVar213._12_4_ = fVar165 + auVar245._12_4_;
          auVar213._16_4_ = fVar165 + auVar245._16_4_;
          auVar213._20_4_ = fVar165 + auVar245._20_4_;
          auVar213._24_4_ = fVar165 + auVar245._24_4_;
          auVar213._28_4_ = fVar165 + auVar245._28_4_;
          uVar15 = vcmpps_avx512vl(auVar213,auVar162,2);
          bVar52 = bVar60 & (byte)uVar16 & (byte)uVar15 | bVar58;
          prim = local_8b0;
          pPVar62 = local_8b8;
          if (bVar52 != 0) {
            abStack_1a0[uVar55 * 0x60] = bVar52;
            auVar137._0_4_ =
                 (uint)(bVar58 & 1) * local_440._0_4_ |
                 (uint)!(bool)(bVar58 & 1) * (int)auVar245._0_4_;
            bVar65 = (bool)(bVar58 >> 1 & 1);
            auVar137._4_4_ = (uint)bVar65 * local_440._4_4_ | (uint)!bVar65 * (int)auVar245._4_4_;
            bVar65 = (bool)(bVar58 >> 2 & 1);
            auVar137._8_4_ = (uint)bVar65 * (int)fStack_438 | (uint)!bVar65 * (int)auVar245._8_4_;
            bVar65 = (bool)(bVar58 >> 3 & 1);
            auVar137._12_4_ = (uint)bVar65 * (int)fStack_434 | (uint)!bVar65 * (int)auVar245._12_4_;
            bVar65 = (bool)(bVar58 >> 4 & 1);
            auVar137._16_4_ = (uint)bVar65 * (int)fStack_430 | (uint)!bVar65 * (int)auVar245._16_4_;
            bVar65 = (bool)(bVar58 >> 5 & 1);
            auVar137._20_4_ = (uint)bVar65 * (int)fStack_42c | (uint)!bVar65 * (int)auVar245._20_4_;
            auVar137._24_4_ =
                 (uint)(bVar58 >> 6) * (int)fStack_428 |
                 (uint)!(bool)(bVar58 >> 6) * (int)auVar245._24_4_;
            auVar137._28_4_ = auVar245._28_4_;
            auVar245 = ZEXT3264(auVar137);
            *(undefined1 (*) [32])(auStack_180 + uVar55 * 0x60) = auVar137;
            uVar66 = vmovlps_avx(local_6d0);
            (&uStack_160)[uVar55 * 0xc] = uVar66;
            aiStack_158[uVar55 * 0x18] = iVar61 + 1;
            uVar55 = (ulong)((int)uVar55 + 1);
          }
        }
      }
    }
    do {
      uVar68 = (uint)uVar55;
      uVar55 = (ulong)(uVar68 - 1);
      if (uVar68 == 0) {
        if (bVar64 != false) {
          return bVar64;
        }
        uVar172 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar31._4_4_ = uVar172;
        auVar31._0_4_ = uVar172;
        auVar31._8_4_ = uVar172;
        auVar31._12_4_ = uVar172;
        auVar31._16_4_ = uVar172;
        auVar31._20_4_ = uVar172;
        auVar31._24_4_ = uVar172;
        auVar31._28_4_ = uVar172;
        uVar15 = vcmpps_avx512vl(local_620,auVar31,2);
        uVar63 = (uint)local_8a8 & (uint)uVar15;
        local_8a8 = (ulong)uVar63;
        if (uVar63 == 0) {
          return false;
        }
        goto LAB_01cb22a9;
      }
      lVar56 = uVar55 * 0x60;
      auVar80 = *(undefined1 (*) [32])(auStack_180 + lVar56);
      auVar184._0_4_ = fVar165 + auVar80._0_4_;
      auVar184._4_4_ = fVar165 + auVar80._4_4_;
      auVar184._8_4_ = fVar165 + auVar80._8_4_;
      auVar184._12_4_ = fVar165 + auVar80._12_4_;
      auVar184._16_4_ = fVar165 + auVar80._16_4_;
      auVar184._20_4_ = fVar165 + auVar80._20_4_;
      auVar184._24_4_ = fVar165 + auVar80._24_4_;
      auVar184._28_4_ = fVar165 + auVar80._28_4_;
      uVar172 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar30._4_4_ = uVar172;
      auVar30._0_4_ = uVar172;
      auVar30._8_4_ = uVar172;
      auVar30._12_4_ = uVar172;
      auVar30._16_4_ = uVar172;
      auVar30._20_4_ = uVar172;
      auVar30._24_4_ = uVar172;
      auVar30._28_4_ = uVar172;
      uVar15 = vcmpps_avx512vl(auVar184,auVar30,2);
      uVar67 = (uint)uVar15 & (uint)abStack_1a0[lVar56];
    } while (uVar67 == 0);
    uVar66 = (&uStack_160)[uVar55 * 0xc];
    auVar173._8_8_ = 0;
    auVar173._0_8_ = uVar66;
    auVar211._8_4_ = 0x7f800000;
    auVar211._0_8_ = 0x7f8000007f800000;
    auVar211._12_4_ = 0x7f800000;
    auVar211._16_4_ = 0x7f800000;
    auVar211._20_4_ = 0x7f800000;
    auVar211._24_4_ = 0x7f800000;
    auVar211._28_4_ = 0x7f800000;
    auVar81 = vblendmps_avx512vl(auVar211,auVar80);
    bVar52 = (byte)uVar67;
    auVar133._0_4_ =
         (uint)(bVar52 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar52 & 1) * (int)auVar80._0_4_;
    bVar65 = (bool)((byte)(uVar67 >> 1) & 1);
    auVar133._4_4_ = (uint)bVar65 * auVar81._4_4_ | (uint)!bVar65 * (int)auVar80._4_4_;
    bVar65 = (bool)((byte)(uVar67 >> 2) & 1);
    auVar133._8_4_ = (uint)bVar65 * auVar81._8_4_ | (uint)!bVar65 * (int)auVar80._8_4_;
    bVar65 = (bool)((byte)(uVar67 >> 3) & 1);
    auVar133._12_4_ = (uint)bVar65 * auVar81._12_4_ | (uint)!bVar65 * (int)auVar80._12_4_;
    bVar65 = (bool)((byte)(uVar67 >> 4) & 1);
    auVar133._16_4_ = (uint)bVar65 * auVar81._16_4_ | (uint)!bVar65 * (int)auVar80._16_4_;
    bVar65 = (bool)((byte)(uVar67 >> 5) & 1);
    auVar133._20_4_ = (uint)bVar65 * auVar81._20_4_ | (uint)!bVar65 * (int)auVar80._20_4_;
    bVar65 = (bool)((byte)(uVar67 >> 6) & 1);
    auVar133._24_4_ = (uint)bVar65 * auVar81._24_4_ | (uint)!bVar65 * (int)auVar80._24_4_;
    auVar133._28_4_ =
         (uVar67 >> 7) * auVar81._28_4_ | (uint)!SUB41(uVar67 >> 7,0) * (int)auVar80._28_4_;
    auVar80 = vshufps_avx(auVar133,auVar133,0xb1);
    auVar80 = vminps_avx(auVar133,auVar80);
    auVar81 = vshufpd_avx(auVar80,auVar80,5);
    auVar80 = vminps_avx(auVar80,auVar81);
    auVar81 = vpermpd_avx2(auVar80,0x4e);
    auVar80 = vminps_avx(auVar80,auVar81);
    uVar15 = vcmpps_avx512vl(auVar133,auVar80,0);
    bVar57 = (byte)uVar15 & bVar52;
    if (bVar57 != 0) {
      uVar67 = (uint)bVar57;
    }
    uVar141 = 0;
    for (; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x80000000) {
      uVar141 = uVar141 + 1;
    }
    iVar61 = aiStack_158[uVar55 * 0x18];
    bVar52 = ~('\x01' << ((byte)uVar141 & 0x1f)) & bVar52;
    abStack_1a0[lVar56] = bVar52;
    if (bVar52 == 0) {
      uVar68 = uVar68 - 1;
    }
    uVar172 = (undefined4)uVar66;
    auVar159._4_4_ = uVar172;
    auVar159._0_4_ = uVar172;
    auVar159._8_4_ = uVar172;
    auVar159._12_4_ = uVar172;
    auVar159._16_4_ = uVar172;
    auVar159._20_4_ = uVar172;
    auVar159._24_4_ = uVar172;
    auVar159._28_4_ = uVar172;
    auVar71 = vmovshdup_avx(auVar173);
    auVar71 = vsubps_avx(auVar71,auVar173);
    auVar185._0_4_ = auVar71._0_4_;
    auVar185._4_4_ = auVar185._0_4_;
    auVar185._8_4_ = auVar185._0_4_;
    auVar185._12_4_ = auVar185._0_4_;
    auVar185._16_4_ = auVar185._0_4_;
    auVar185._20_4_ = auVar185._0_4_;
    auVar185._24_4_ = auVar185._0_4_;
    auVar185._28_4_ = auVar185._0_4_;
    auVar71 = vfmadd132ps_fma(auVar185,auVar159,_DAT_01faff20);
    auVar80 = ZEXT1632(auVar71);
    local_400[0] = (RTCHitN)auVar80[0];
    local_400[1] = (RTCHitN)auVar80[1];
    local_400[2] = (RTCHitN)auVar80[2];
    local_400[3] = (RTCHitN)auVar80[3];
    local_400[4] = (RTCHitN)auVar80[4];
    local_400[5] = (RTCHitN)auVar80[5];
    local_400[6] = (RTCHitN)auVar80[6];
    local_400[7] = (RTCHitN)auVar80[7];
    local_400[8] = (RTCHitN)auVar80[8];
    local_400[9] = (RTCHitN)auVar80[9];
    local_400[10] = (RTCHitN)auVar80[10];
    local_400[0xb] = (RTCHitN)auVar80[0xb];
    local_400[0xc] = (RTCHitN)auVar80[0xc];
    local_400[0xd] = (RTCHitN)auVar80[0xd];
    local_400[0xe] = (RTCHitN)auVar80[0xe];
    local_400[0xf] = (RTCHitN)auVar80[0xf];
    local_400[0x10] = (RTCHitN)auVar80[0x10];
    local_400[0x11] = (RTCHitN)auVar80[0x11];
    local_400[0x12] = (RTCHitN)auVar80[0x12];
    local_400[0x13] = (RTCHitN)auVar80[0x13];
    local_400[0x14] = (RTCHitN)auVar80[0x14];
    local_400[0x15] = (RTCHitN)auVar80[0x15];
    local_400[0x16] = (RTCHitN)auVar80[0x16];
    local_400[0x17] = (RTCHitN)auVar80[0x17];
    local_400[0x18] = (RTCHitN)auVar80[0x18];
    local_400[0x19] = (RTCHitN)auVar80[0x19];
    local_400[0x1a] = (RTCHitN)auVar80[0x1a];
    local_400[0x1b] = (RTCHitN)auVar80[0x1b];
    local_400[0x1c] = (RTCHitN)auVar80[0x1c];
    local_400[0x1d] = (RTCHitN)auVar80[0x1d];
    local_400[0x1e] = (RTCHitN)auVar80[0x1e];
    local_400[0x1f] = (RTCHitN)auVar80[0x1f];
    local_6d0._8_8_ = 0;
    local_6d0._0_8_ = *(ulong *)(local_400 + (ulong)uVar141 * 4);
    uVar55 = (ulong)uVar68;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }